

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::forward
          (DeconvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int *piVar18;
  uint *puVar19;
  void *pvVar20;
  size_t sVar21;
  undefined4 *puVar22;
  float *pfVar23;
  Layer *pLVar24;
  byte bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  byte bVar33;
  byte bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  ulong uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  float afVar59 [16];
  float afVar60 [16];
  float afVar61 [16];
  float afVar62 [16];
  float afVar63 [16];
  float afVar64 [16];
  float afVar65 [16];
  float afVar66 [16];
  float afVar67 [16];
  float afVar68 [16];
  float afVar69 [16];
  float afVar70 [16];
  float afVar71 [16];
  float afVar72 [16];
  float afVar73 [16];
  float afVar74 [16];
  float afVar75 [16];
  Option OVar76;
  undefined1 auVar77 [36];
  Mat *pMVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  long lVar88;
  bool bVar89;
  int iVar90;
  ulong uVar91;
  int iVar92;
  uint uVar93;
  ulong uVar94;
  int iVar95;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 (*pauVar96) [64];
  undefined1 (*pauVar97) [32];
  undefined1 (*pauVar98) [16];
  void *pvVar99;
  size_t sVar100;
  ulong uVar101;
  long lVar102;
  ulong uVar103;
  ushort uVar104;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar128 [28];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  int iVar192;
  int iVar193;
  int iVar194;
  int iVar195;
  int iVar196;
  int iVar197;
  int iVar198;
  int iVar199;
  int iVar200;
  int iVar201;
  int iVar202;
  int iVar203;
  int iVar204;
  int iVar205;
  int iVar206;
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  float fVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  float __x;
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  v4sf one;
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar234 [32];
  undefined1 auVar233 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM29 [64];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_384;
  float *local_370;
  ulong local_368;
  int local_338;
  ulong local_320;
  uint local_318;
  int local_308;
  void *local_2e0;
  Mat local_2c8;
  void *local_280;
  long local_278;
  ulong local_270;
  int local_268;
  int iStack_264;
  undefined8 uStack_260;
  undefined1 local_258 [24];
  int iStack_240;
  Allocator *pAStack_238;
  undefined8 uStack_230;
  int iStack_228;
  int iStack_224;
  int iStack_220;
  undefined1 auStack_23c [36];
  size_t local_218;
  undefined1 local_208 [40];
  undefined1 local_1e0 [16];
  int local_1d0;
  size_t local_1c8;
  undefined1 local_1b8 [16];
  Mat *local_1a0;
  void *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  Allocator *local_188;
  int local_180;
  Allocator *local_178;
  undefined1 local_170 [16];
  int local_160;
  ulong local_158;
  void *local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  ulong local_138;
  int local_130;
  Allocator *local_128;
  undefined1 local_120 [16];
  int local_110;
  ulong local_108;
  undefined1 local_f8 [16];
  Option *local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  void *local_c0;
  undefined1 local_b8 [64];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  undefined1 auVar119 [16];
  undefined1 auVar167 [64];
  undefined1 auVar142 [32];
  
  auVar105 = in_ZMM29._0_16_;
  uVar17 = bottom_blob->elemsize;
  iVar95 = bottom_blob->elempack;
  uVar93 = 1;
  local_b8._0_8_ = (long)iVar95;
  if (opt->use_packing_layout == true) {
    uVar93 = (this->super_DeconvolutionDepthWise).num_output;
    if ((uVar93 & 0xf) == 0) {
      uVar93 = 0x10;
    }
    else if ((uVar93 & 7) == 0) {
      uVar93 = 8;
    }
    else {
      uVar93 = (uint)((uVar93 & 3) == 0) * 3 + 1;
    }
  }
  uVar3 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  auVar109._4_4_ = uVar8;
  auVar109._0_4_ = uVar3;
  uVar4 = (this->super_DeconvolutionDepthWise).kernel_w;
  uVar9 = (this->super_DeconvolutionDepthWise).kernel_h;
  auVar108._4_4_ = uVar9;
  auVar108._0_4_ = uVar4;
  uVar5 = (this->super_DeconvolutionDepthWise).dilation_w;
  uVar10 = (this->super_DeconvolutionDepthWise).dilation_h;
  auVar110._4_4_ = uVar10;
  auVar110._0_4_ = uVar5;
  uVar6 = (this->super_DeconvolutionDepthWise).stride_w;
  uVar11 = (this->super_DeconvolutionDepthWise).stride_h;
  auVar111._4_4_ = uVar11;
  auVar111._0_4_ = uVar6;
  uVar15 = bottom_blob->c;
  uVar91 = (ulong)uVar15;
  uVar7 = (this->super_DeconvolutionDepthWise).output_pad_right;
  uVar12 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  auVar112._4_4_ = uVar12;
  auVar112._0_4_ = uVar7;
  local_2c8.cstep = 0;
  auVar107 = (undefined1  [16])0x0;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize = 0;
  local_2c8.elempack = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  auVar106._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar106._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar106._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar106._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  uVar103 = vpcmpd_avx512vl((undefined1  [16])0x0,auVar106,1);
  lVar102 = 0x10;
  if (((uVar103 & 0xf) == 0) &&
     ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
       ((this->super_DeconvolutionDepthWise).output_h < 1)) && (lVar102 = 8, &local_2c8 != top_blob)
      ))) {
    piVar18 = top_blob->refcount;
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + 1;
      UNLOCK();
    }
    local_2c8.data = top_blob->data;
    local_2c8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_2c8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_2c8.elemsize = top_blob->elemsize;
    local_2c8.elempack = top_blob->elempack;
    local_2c8.allocator = top_blob->allocator;
    auVar107._0_4_ = top_blob->dims;
    auVar107._4_4_ = top_blob->w;
    uVar13 = top_blob->h;
    uVar14 = top_blob->d;
    auVar107._8_8_ = CONCAT44(uVar14,uVar13);
    local_2c8.c = top_blob->c;
    local_2c8.cstep = top_blob->cstep;
    local_2c8.dims = auVar107._0_4_;
    local_2c8.w = auVar107._4_4_;
    local_2c8._48_8_ = auVar107._8_8_;
  }
  auVar109._8_8_ = 0;
  uStack_260 = 0;
  auVar112._8_8_ = 0;
  auVar111._8_8_ = 0;
  auVar110._8_8_ = 0;
  auVar108._8_8_ = 0;
  auVar107 = vpcmpeqd_avx(auVar107,auVar107);
  auVar106 = vpaddd_avx(auVar108,auVar107);
  local_f8 = vpmulld_avx(auVar106,auVar110);
  auVar106 = vpaddd_avx(auVar109,auVar107);
  auVar106 = vpmulld_avx(auVar111,auVar106);
  auVar106 = vpaddd_avx(local_f8,auVar106);
  auVar106 = vpaddd_avx(auVar106,auVar112);
  local_1b8 = vpsubd_avx(auVar106,auVar107);
  sVar100 = (uVar17 / (ulong)(long)iVar95) * (ulong)uVar93;
  iVar87 = local_1b8._0_4_;
  iVar92 = local_1b8._4_4_;
  local_268 = uVar3;
  iStack_264 = uVar8;
  Mat::create(&local_2c8,iVar87,iVar92,(this->super_DeconvolutionDepthWise).num_output / (int)uVar93
              ,sVar100,uVar93,*(Allocator **)(&opt->lightmode + lVar102));
  iVar95 = iStack_264;
  afVar75 = _ps512_cephes_log_p8;
  afVar74 = _ps512_cephes_log_p7;
  afVar73 = _ps512_cephes_log_p6;
  afVar72 = _ps512_cephes_log_p5;
  afVar71 = _ps512_cephes_log_p4;
  afVar70 = _ps512_cephes_log_p3;
  afVar69 = _ps512_cephes_log_p2;
  afVar68 = ::_ps512_cephes_exp_p5;
  afVar67 = ::_ps512_cephes_exp_p4;
  afVar66 = ::_ps512_cephes_exp_p3;
  afVar65 = ::_ps512_cephes_exp_p2;
  afVar64 = ::_ps512_cephes_exp_p1;
  afVar63 = ::_ps512_cephes_exp_p0;
  afVar62 = ::_ps512_cephes_LOG2EF;
  afVar61 = ::_ps512_exp_lo;
  afVar60 = ::_ps512_exp_hi;
  afVar59 = ::_ps512_1;
  local_338 = -100;
  if ((local_2c8.data == (void *)0x0) || ((long)local_2c8.c * local_2c8.cstep == 0))
  goto LAB_00485071;
  iVar83 = (this->super_DeconvolutionDepthWise).num_output;
  iVar86 = local_b8._0_4_;
  iVar79 = (this->super_DeconvolutionDepthWise).group;
  local_1a0 = top_blob;
  local_e0 = opt;
  if (iVar79 == iVar83 && uVar15 * iVar86 == iVar79) {
    uVar93 = (this->super_DeconvolutionDepthWise).kernel_h *
             (this->super_DeconvolutionDepthWise).kernel_w;
    local_270 = (ulong)uVar93;
    if (iVar86 < 8) {
      if (iVar86 == 1) {
        if (0 < (int)uVar15) {
          auVar105._4_4_ = iStack_264;
          auVar105._0_4_ = local_268;
          auVar105._8_8_ = uStack_260;
          local_c0 = local_2c8.data;
          local_c8 = local_2c8.cstep * local_2c8.elemsize;
          local_2e0 = (this->weight_data_tm).data;
          iVar83 = bottom_blob->w;
          local_d0 = bottom_blob->data;
          sVar100 = bottom_blob->elemsize;
          local_d8 = bottom_blob->cstep * sVar100;
          auVar210 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar17 = vpcmpd_avx512vl(ZEXT816(0) << 0x40,local_1b8,1);
          local_270 = 1;
          if (1 < (int)uVar15) {
            local_270 = uVar91;
          }
          local_1b8._0_4_ = local_f8._4_4_;
          auVar153 = vpbroadcastd_avx512f(auVar105);
          local_268 = (int)((long)(int)uVar93 << 2);
          iStack_264 = (int)((ulong)((long)(int)uVar93 << 2) >> 0x20);
          local_320 = 0;
          auVar154 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar155 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar156 = vpmovsxbd_avx512f(_DAT_00613604);
          auVar157 = vpternlogd_avx512f(in_ZMM17,in_ZMM17,in_ZMM17,0xff);
          auVar158 = vpbroadcastq_avx512f(ZEXT816(0x10));
          auVar159 = vpbroadcastd_avx512f(ZEXT416(0x10));
          local_b8 = vmovdqu64_avx512f(auVar153);
          do {
            pvVar20 = local_d0;
            if (((uVar17 & 0xf) >> 1 & 1) != 0) {
              lVar102 = local_d8 * local_320;
              local_370 = (float *)(local_c8 * local_320 + (long)local_c0);
              uVar93 = (this->super_DeconvolutionDepthWise).kernel_h;
              local_278 = CONCAT44(local_278._4_4_,(this->super_DeconvolutionDepthWise).bias_term);
              iVar79 = (this->super_DeconvolutionDepthWise).activation_type;
              iVar86 = 0;
              do {
                if ((uVar17 & 1) != 0) {
                  local_280 = (this->super_DeconvolutionDepthWise).bias_data.data;
                  iVar16 = (this->super_DeconvolutionDepthWise).dilation_h;
                  iVar90 = iVar86 - local_1b8._0_4_;
                  pfVar23 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                  iVar80 = 0;
                  do {
                    if ((int)local_278 == 0) {
                      auVar218 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar218 = ZEXT464(*(uint *)((long)local_280 + local_320 * 4));
                    }
                    auVar105 = auVar218._0_16_;
                    if (0 < (int)uVar93) {
                      iVar81 = (this->super_DeconvolutionDepthWise).stride_h;
                      uVar15 = (this->super_DeconvolutionDepthWise).kernel_w;
                      iVar82 = (this->super_DeconvolutionDepthWise).stride_w;
                      auVar160 = vpbroadcastq_avx512f();
                      auVar161 = vpbroadcastd_avx512f
                                           (ZEXT416((uint)(this->super_DeconvolutionDepthWise).
                                                          dilation_w));
                      auVar162 = vpbroadcastd_avx512f();
                      uVar103 = 0;
                      pvVar99 = local_2e0;
                      do {
                        iVar84 = iVar16 * (int)uVar103 + iVar90;
                        if (((-1 < iVar84) &&
                            (iVar85 = iVar84 / iVar81, iVar85 < iVar95 && iVar84 % iVar81 == 0)) &&
                           (0 < (int)uVar15)) {
                          auVar225 = ZEXT1664(CONCAT124(auVar210._4_12_,auVar218._0_4_));
                          uVar91 = 0;
                          auVar218 = vmovdqa64_avx512f(auVar155);
                          auVar163 = vmovdqa64_avx512f(auVar154);
                          auVar164 = vmovdqa64_avx512f(auVar156);
                          do {
                            uVar43 = vpcmpuq_avx512f(auVar218,auVar160,2);
                            uVar44 = vpcmpuq_avx512f(auVar163,auVar160,2);
                            bVar33 = (byte)uVar44;
                            uVar104 = CONCAT11(bVar33,(byte)uVar43);
                            auVar165 = vpmulld_avx512f(auVar161,auVar164);
                            auVar165 = vpaddd_avx512f(auVar162,auVar165);
                            uVar94 = vpcmpgtd_avx512f(auVar165,auVar157);
                            uVar94 = uVar104 & uVar94;
                            if ((uVar94 & 1) != 0) {
                              in_ZMM10 = ZEXT464((uint)(auVar165._0_4_ % iVar82));
                            }
                            if ((uVar94 & 2) != 0) {
                              auVar105 = vpinsrd_avx(in_ZMM10._0_16_,auVar165._4_4_ % iVar82,1);
                              in_ZMM10 = vinserti32x4_avx512f(in_ZMM10,auVar105,0);
                            }
                            if ((uVar94 & 4) != 0) {
                              auVar105 = vpinsrd_avx(in_ZMM10._0_16_,auVar165._8_4_ % iVar82,2);
                              in_ZMM10 = vinserti32x4_avx512f(in_ZMM10,auVar105,0);
                            }
                            if ((uVar94 & 8) != 0) {
                              auVar105 = vpinsrd_avx(in_ZMM10._0_16_,auVar165._12_4_ % iVar82,3);
                              in_ZMM10 = vinserti32x4_avx512f(in_ZMM10,auVar105,0);
                            }
                            auVar167 = in_ZMM10;
                            if ((uVar94 & 0x10) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar167._0_16_ = in_ZMM10._0_16_;
                              auVar167._16_4_ = auVar166._16_4_;
                              auVar167._20_4_ = in_ZMM10._20_4_;
                              auVar167._24_4_ = in_ZMM10._24_4_;
                              auVar167._28_4_ = in_ZMM10._28_4_;
                              auVar167._32_4_ = in_ZMM10._32_4_;
                              auVar167._36_4_ = in_ZMM10._36_4_;
                              auVar167._40_4_ = in_ZMM10._40_4_;
                              auVar167._44_4_ = in_ZMM10._44_4_;
                              auVar167._48_4_ = in_ZMM10._48_4_;
                              auVar167._52_4_ = in_ZMM10._52_4_;
                              auVar167._56_4_ = in_ZMM10._56_4_;
                              auVar167._60_4_ = in_ZMM10._60_4_;
                            }
                            auVar168 = auVar167;
                            if ((uVar94 & 0x20) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar168._0_20_ = auVar167._0_20_;
                              auVar168._20_4_ = auVar166._20_4_;
                              auVar168._24_4_ = auVar167._24_4_;
                              auVar168._28_4_ = auVar167._28_4_;
                              auVar168._32_4_ = auVar167._32_4_;
                              auVar168._36_4_ = auVar167._36_4_;
                              auVar168._40_4_ = auVar167._40_4_;
                              auVar168._44_4_ = auVar167._44_4_;
                              auVar168._48_4_ = auVar167._48_4_;
                              auVar168._52_4_ = auVar167._52_4_;
                              auVar168._56_4_ = auVar167._56_4_;
                              auVar168._60_4_ = auVar167._60_4_;
                            }
                            auVar169 = auVar168;
                            if ((uVar94 & 0x40) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar169._0_24_ = auVar168._0_24_;
                              auVar169._24_4_ = auVar166._24_4_;
                              auVar169._28_4_ = auVar168._28_4_;
                              auVar169._32_4_ = auVar168._32_4_;
                              auVar169._36_4_ = auVar168._36_4_;
                              auVar169._40_4_ = auVar168._40_4_;
                              auVar169._44_4_ = auVar168._44_4_;
                              auVar169._48_4_ = auVar168._48_4_;
                              auVar169._52_4_ = auVar168._52_4_;
                              auVar169._56_4_ = auVar168._56_4_;
                              auVar169._60_4_ = auVar168._60_4_;
                            }
                            auVar170 = auVar169;
                            if ((uVar94 & 0x80) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar170._0_28_ = auVar169._0_28_;
                              auVar170._28_4_ = auVar166._28_4_;
                              auVar170._32_4_ = auVar169._32_4_;
                              auVar170._36_4_ = auVar169._36_4_;
                              auVar170._40_4_ = auVar169._40_4_;
                              auVar170._44_4_ = auVar169._44_4_;
                              auVar170._48_4_ = auVar169._48_4_;
                              auVar170._52_4_ = auVar169._52_4_;
                              auVar170._56_4_ = auVar169._56_4_;
                              auVar170._60_4_ = auVar169._60_4_;
                            }
                            vextracti32x4_avx512f(auVar165,2);
                            auVar171 = auVar170;
                            if ((uVar94 & 0x100) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar171._0_32_ = auVar170._0_32_;
                              auVar171._32_4_ = auVar166._32_4_;
                              auVar171._36_4_ = auVar170._36_4_;
                              auVar171._40_4_ = auVar170._40_4_;
                              auVar171._44_4_ = auVar170._44_4_;
                              auVar171._48_4_ = auVar170._48_4_;
                              auVar171._52_4_ = auVar170._52_4_;
                              auVar171._56_4_ = auVar170._56_4_;
                              auVar171._60_4_ = auVar170._60_4_;
                            }
                            auVar172 = auVar171;
                            if ((uVar94 & 0x200) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar172._0_36_ = auVar171._0_36_;
                              auVar172._36_4_ = auVar166._36_4_;
                              auVar172._40_4_ = auVar171._40_4_;
                              auVar172._44_4_ = auVar171._44_4_;
                              auVar172._48_4_ = auVar171._48_4_;
                              auVar172._52_4_ = auVar171._52_4_;
                              auVar172._56_4_ = auVar171._56_4_;
                              auVar172._60_4_ = auVar171._60_4_;
                            }
                            auVar173 = auVar172;
                            if ((uVar94 & 0x400) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar173._0_40_ = auVar172._0_40_;
                              auVar173._40_4_ = auVar166._40_4_;
                              auVar173._44_4_ = auVar172._44_4_;
                              auVar173._48_4_ = auVar172._48_4_;
                              auVar173._52_4_ = auVar172._52_4_;
                              auVar173._56_4_ = auVar172._56_4_;
                              auVar173._60_4_ = auVar172._60_4_;
                            }
                            auVar174 = auVar173;
                            if ((uVar94 & 0x800) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar174._0_44_ = auVar173._0_44_;
                              auVar174._44_4_ = auVar166._44_4_;
                              auVar174._48_4_ = auVar173._48_4_;
                              auVar174._52_4_ = auVar173._52_4_;
                              auVar174._56_4_ = auVar173._56_4_;
                              auVar174._60_4_ = auVar173._60_4_;
                            }
                            vextracti32x4_avx512f(auVar165,3);
                            auVar175 = auVar174;
                            if ((uVar94 & 0x1000) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar175._0_48_ = auVar174._0_48_;
                              auVar175._48_4_ = auVar166._48_4_;
                              auVar175._52_4_ = auVar174._52_4_;
                              auVar175._56_4_ = auVar174._56_4_;
                              auVar175._60_4_ = auVar174._60_4_;
                            }
                            auVar176 = auVar175;
                            if ((uVar94 & 0x2000) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar176._0_52_ = auVar175._0_52_;
                              auVar176._52_4_ = auVar166._52_4_;
                              auVar176._56_4_ = auVar175._56_4_;
                              auVar176._60_4_ = auVar175._60_4_;
                            }
                            auVar177 = auVar176;
                            if ((uVar94 & 0x4000) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar177._0_56_ = auVar176._0_56_;
                              auVar177._56_4_ = auVar166._56_4_;
                              auVar177._60_4_ = auVar176._60_4_;
                            }
                            auVar235 = auVar177;
                            if ((uVar94 & 0x8000) != 0) {
                              auVar166 = vpbroadcastd_avx512f();
                              auVar235._60_4_ = auVar166._60_4_;
                              auVar235._0_60_ = auVar177._0_60_;
                            }
                            uVar101 = vptestnmd_avx512f(auVar235,auVar235);
                            uVar94 = uVar94 & uVar101;
                            if ((uVar94 & 1) != 0) {
                              auVar235 = ZEXT464((uint)(auVar165._0_4_ / iVar82));
                            }
                            if ((uVar94 & 2) != 0) {
                              auVar105 = vpinsrd_avx(auVar235._0_16_,auVar165._4_4_ / iVar82,1);
                              auVar235 = vinserti32x4_avx512f(auVar235,auVar105,0);
                            }
                            if ((uVar94 & 4) != 0) {
                              auVar105 = vpinsrd_avx(auVar235._0_16_,auVar165._8_4_ / iVar82,2);
                              auVar235 = vinserti32x4_avx512f(auVar235,auVar105,0);
                            }
                            if ((uVar94 & 8) != 0) {
                              auVar105 = vpinsrd_avx(auVar235._0_16_,auVar165._12_4_ / iVar82,3);
                              auVar235 = vinserti32x4_avx512f(auVar235,auVar105,0);
                            }
                            auVar178 = auVar235;
                            if ((uVar94 & 0x10) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar178._0_16_ = auVar235._0_16_;
                              auVar178._16_4_ = auVar165._16_4_;
                              auVar178._20_4_ = auVar235._20_4_;
                              auVar178._24_4_ = auVar235._24_4_;
                              auVar178._28_4_ = auVar235._28_4_;
                              auVar178._32_4_ = auVar235._32_4_;
                              auVar178._36_4_ = auVar235._36_4_;
                              auVar178._40_4_ = auVar235._40_4_;
                              auVar178._44_4_ = auVar235._44_4_;
                              auVar178._48_4_ = auVar235._48_4_;
                              auVar178._52_4_ = auVar235._52_4_;
                              auVar178._56_4_ = auVar235._56_4_;
                              auVar178._60_4_ = auVar235._60_4_;
                            }
                            auVar179 = auVar178;
                            if ((uVar94 & 0x20) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar179._0_20_ = auVar178._0_20_;
                              auVar179._20_4_ = auVar165._20_4_;
                              auVar179._24_4_ = auVar178._24_4_;
                              auVar179._28_4_ = auVar178._28_4_;
                              auVar179._32_4_ = auVar178._32_4_;
                              auVar179._36_4_ = auVar178._36_4_;
                              auVar179._40_4_ = auVar178._40_4_;
                              auVar179._44_4_ = auVar178._44_4_;
                              auVar179._48_4_ = auVar178._48_4_;
                              auVar179._52_4_ = auVar178._52_4_;
                              auVar179._56_4_ = auVar178._56_4_;
                              auVar179._60_4_ = auVar178._60_4_;
                            }
                            auVar180 = auVar179;
                            if ((uVar94 & 0x40) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar180._0_24_ = auVar179._0_24_;
                              auVar180._24_4_ = auVar165._24_4_;
                              auVar180._28_4_ = auVar179._28_4_;
                              auVar180._32_4_ = auVar179._32_4_;
                              auVar180._36_4_ = auVar179._36_4_;
                              auVar180._40_4_ = auVar179._40_4_;
                              auVar180._44_4_ = auVar179._44_4_;
                              auVar180._48_4_ = auVar179._48_4_;
                              auVar180._52_4_ = auVar179._52_4_;
                              auVar180._56_4_ = auVar179._56_4_;
                              auVar180._60_4_ = auVar179._60_4_;
                            }
                            auVar181 = auVar180;
                            if ((uVar94 & 0x80) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar181._0_28_ = auVar180._0_28_;
                              auVar181._28_4_ = auVar165._28_4_;
                              auVar181._32_4_ = auVar180._32_4_;
                              auVar181._36_4_ = auVar180._36_4_;
                              auVar181._40_4_ = auVar180._40_4_;
                              auVar181._44_4_ = auVar180._44_4_;
                              auVar181._48_4_ = auVar180._48_4_;
                              auVar181._52_4_ = auVar180._52_4_;
                              auVar181._56_4_ = auVar180._56_4_;
                              auVar181._60_4_ = auVar180._60_4_;
                            }
                            auVar182 = auVar181;
                            if ((uVar94 & 0x100) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar182._0_32_ = auVar181._0_32_;
                              auVar182._32_4_ = auVar165._32_4_;
                              auVar182._36_4_ = auVar181._36_4_;
                              auVar182._40_4_ = auVar181._40_4_;
                              auVar182._44_4_ = auVar181._44_4_;
                              auVar182._48_4_ = auVar181._48_4_;
                              auVar182._52_4_ = auVar181._52_4_;
                              auVar182._56_4_ = auVar181._56_4_;
                              auVar182._60_4_ = auVar181._60_4_;
                            }
                            auVar183 = auVar182;
                            if ((uVar94 & 0x200) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar183._0_36_ = auVar182._0_36_;
                              auVar183._36_4_ = auVar165._36_4_;
                              auVar183._40_4_ = auVar182._40_4_;
                              auVar183._44_4_ = auVar182._44_4_;
                              auVar183._48_4_ = auVar182._48_4_;
                              auVar183._52_4_ = auVar182._52_4_;
                              auVar183._56_4_ = auVar182._56_4_;
                              auVar183._60_4_ = auVar182._60_4_;
                            }
                            auVar184 = auVar183;
                            if ((uVar94 & 0x400) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar184._0_40_ = auVar183._0_40_;
                              auVar184._40_4_ = auVar165._40_4_;
                              auVar184._44_4_ = auVar183._44_4_;
                              auVar184._48_4_ = auVar183._48_4_;
                              auVar184._52_4_ = auVar183._52_4_;
                              auVar184._56_4_ = auVar183._56_4_;
                              auVar184._60_4_ = auVar183._60_4_;
                            }
                            auVar185 = auVar184;
                            if ((uVar94 & 0x800) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar185._0_44_ = auVar184._0_44_;
                              auVar185._44_4_ = auVar165._44_4_;
                              auVar185._48_4_ = auVar184._48_4_;
                              auVar185._52_4_ = auVar184._52_4_;
                              auVar185._56_4_ = auVar184._56_4_;
                              auVar185._60_4_ = auVar184._60_4_;
                            }
                            auVar186 = auVar185;
                            if ((uVar94 & 0x1000) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar186._0_48_ = auVar185._0_48_;
                              auVar186._48_4_ = auVar165._48_4_;
                              auVar186._52_4_ = auVar185._52_4_;
                              auVar186._56_4_ = auVar185._56_4_;
                              auVar186._60_4_ = auVar185._60_4_;
                            }
                            auVar187 = auVar186;
                            if ((uVar94 & 0x2000) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar187._0_52_ = auVar186._0_52_;
                              auVar187._52_4_ = auVar165._52_4_;
                              auVar187._56_4_ = auVar186._56_4_;
                              auVar187._60_4_ = auVar186._60_4_;
                            }
                            auVar188 = auVar187;
                            if ((uVar94 & 0x4000) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              auVar188._0_56_ = auVar187._0_56_;
                              auVar188._56_4_ = auVar165._56_4_;
                              auVar188._60_4_ = auVar187._60_4_;
                            }
                            in_ZMM10 = auVar188;
                            if ((uVar94 & 0x8000) != 0) {
                              auVar165 = vpbroadcastd_avx512f();
                              in_ZMM10._60_4_ = auVar165._60_4_;
                              in_ZMM10._0_60_ = auVar188._0_60_;
                            }
                            uVar101 = vpcmpgtd_avx512f(auVar153,in_ZMM10);
                            uVar101 = uVar94 & uVar101;
                            auVar165 = vgatherdps_avx512f(*(undefined4 *)
                                                           ((long)pvVar20 +
                                                           (long)pvVar99 * 4 +
                                                           (long)iVar85 * (long)iVar83 * sVar100 +
                                                           lVar102));
                            bVar25 = (byte)uVar101;
                            auVar189._4_4_ = (uint)((byte)(uVar101 >> 1) & 1) * auVar165._4_4_;
                            auVar189._0_4_ = (uint)(bVar25 & 1) * auVar165._0_4_;
                            auVar189._8_4_ = (uint)((byte)(uVar101 >> 2) & 1) * auVar165._8_4_;
                            auVar189._12_4_ = (uint)((byte)(uVar101 >> 3) & 1) * auVar165._12_4_;
                            auVar189._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * auVar165._16_4_;
                            auVar189._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * auVar165._20_4_;
                            auVar189._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * auVar165._24_4_;
                            auVar189._28_4_ = (uint)((byte)(uVar101 >> 7) & 1) * auVar165._28_4_;
                            bVar34 = (byte)(uVar101 >> 8);
                            auVar189._32_4_ = (uint)(bVar34 & 1) * auVar165._32_4_;
                            auVar189._36_4_ = (uint)((byte)(uVar101 >> 9) & 1) * auVar165._36_4_;
                            auVar189._40_4_ = (uint)((byte)(uVar101 >> 10) & 1) * auVar165._40_4_;
                            auVar189._44_4_ = (uint)((byte)(uVar101 >> 0xb) & 1) * auVar165._44_4_;
                            auVar189._48_4_ = (uint)((byte)(uVar101 >> 0xc) & 1) * auVar165._48_4_;
                            auVar189._52_4_ = (uint)((byte)(uVar101 >> 0xd) & 1) * auVar165._52_4_;
                            auVar189._56_4_ = (uint)((byte)(uVar101 >> 0xe) & 1) * auVar165._56_4_;
                            auVar189._60_4_ = (uint)(byte)(uVar101 >> 0xf) * auVar165._60_4_;
                            piVar18 = (int *)((long)pvVar99 + uVar91 * 4);
                            auVar190._4_4_ = (uint)((byte)(uVar101 >> 1) & 1) * piVar18[1];
                            auVar190._0_4_ = (uint)(bVar25 & 1) * *piVar18;
                            auVar190._8_4_ = (uint)((byte)(uVar101 >> 2) & 1) * piVar18[2];
                            auVar190._12_4_ = (uint)((byte)(uVar101 >> 3) & 1) * piVar18[3];
                            auVar190._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * piVar18[4];
                            auVar190._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * piVar18[5];
                            auVar190._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * piVar18[6];
                            auVar190._28_4_ = (uint)((byte)(uVar101 >> 7) & 1) * piVar18[7];
                            auVar190._32_4_ = (uint)(bVar34 & 1) * piVar18[8];
                            auVar190._36_4_ = (uint)((byte)(uVar101 >> 9) & 1) * piVar18[9];
                            auVar190._40_4_ = (uint)((byte)(uVar101 >> 10) & 1) * piVar18[10];
                            auVar190._44_4_ = (uint)((byte)(uVar101 >> 0xb) & 1) * piVar18[0xb];
                            auVar190._48_4_ = (uint)((byte)(uVar101 >> 0xc) & 1) * piVar18[0xc];
                            auVar190._52_4_ = (uint)((byte)(uVar101 >> 0xd) & 1) * piVar18[0xd];
                            auVar190._56_4_ = (uint)((byte)(uVar101 >> 0xe) & 1) * piVar18[0xe];
                            auVar190._60_4_ = (uint)(byte)(uVar101 >> 0xf) * piVar18[0xf];
                            uVar42 = vpcmpd_avx512f(in_ZMM10,auVar153,5);
                            uVar94 = uVar94 & uVar42;
                            auVar165 = vfmadd231ps_avx512f(auVar225,auVar190,auVar189);
                            iVar84 = auVar225._0_4_;
                            bVar26 = (bool)((byte)(uVar101 >> 1) & 1);
                            iVar192 = auVar225._4_4_;
                            bVar27 = (bool)((byte)(uVar101 >> 2) & 1);
                            iVar193 = auVar225._8_4_;
                            bVar28 = (bool)((byte)(uVar101 >> 3) & 1);
                            iVar194 = auVar225._12_4_;
                            bVar29 = (bool)((byte)(uVar101 >> 4) & 1);
                            iVar195 = auVar225._16_4_;
                            bVar30 = (bool)((byte)(uVar101 >> 5) & 1);
                            iVar196 = auVar225._20_4_;
                            bVar31 = (bool)((byte)(uVar101 >> 6) & 1);
                            iVar197 = auVar225._24_4_;
                            bVar32 = (bool)((byte)(uVar101 >> 7) & 1);
                            iVar198 = auVar225._28_4_;
                            iVar199 = auVar225._32_4_;
                            bVar35 = (bool)((byte)(uVar101 >> 9) & 1);
                            iVar200 = auVar225._36_4_;
                            bVar36 = (bool)((byte)(uVar101 >> 10) & 1);
                            iVar201 = auVar225._40_4_;
                            bVar37 = (bool)((byte)(uVar101 >> 0xb) & 1);
                            iVar202 = auVar225._44_4_;
                            bVar38 = (bool)((byte)(uVar101 >> 0xc) & 1);
                            iVar203 = auVar225._48_4_;
                            bVar39 = (bool)((byte)(uVar101 >> 0xd) & 1);
                            iVar204 = auVar225._52_4_;
                            bVar40 = (bool)((byte)(uVar101 >> 0xe) & 1);
                            iVar205 = auVar225._56_4_;
                            bVar41 = SUB81(uVar101 >> 0xf,0);
                            iVar206 = auVar225._60_4_;
                            bVar89 = (bool)((byte)uVar94 & 1);
                            auVar225._0_4_ =
                                 (uint)bVar89 * iVar84 |
                                 (uint)!bVar89 *
                                 ((uint)(bVar25 & 1) * auVar165._0_4_ |
                                 (uint)!(bool)(bVar25 & 1) * iVar84);
                            bVar89 = (bool)((byte)(uVar94 >> 1) & 1);
                            auVar225._4_4_ =
                                 (uint)bVar89 * iVar192 |
                                 (uint)!bVar89 *
                                 ((uint)bVar26 * auVar165._4_4_ | (uint)!bVar26 * iVar192);
                            bVar89 = (bool)((byte)(uVar94 >> 2) & 1);
                            auVar225._8_4_ =
                                 (uint)bVar89 * iVar193 |
                                 (uint)!bVar89 *
                                 ((uint)bVar27 * auVar165._8_4_ | (uint)!bVar27 * iVar193);
                            bVar89 = (bool)((byte)(uVar94 >> 3) & 1);
                            auVar225._12_4_ =
                                 (uint)bVar89 * iVar194 |
                                 (uint)!bVar89 *
                                 ((uint)bVar28 * auVar165._12_4_ | (uint)!bVar28 * iVar194);
                            bVar89 = (bool)((byte)(uVar94 >> 4) & 1);
                            auVar225._16_4_ =
                                 (uint)bVar89 * iVar195 |
                                 (uint)!bVar89 *
                                 ((uint)bVar29 * auVar165._16_4_ | (uint)!bVar29 * iVar195);
                            bVar89 = (bool)((byte)(uVar94 >> 5) & 1);
                            auVar225._20_4_ =
                                 (uint)bVar89 * iVar196 |
                                 (uint)!bVar89 *
                                 ((uint)bVar30 * auVar165._20_4_ | (uint)!bVar30 * iVar196);
                            bVar89 = (bool)((byte)(uVar94 >> 6) & 1);
                            auVar225._24_4_ =
                                 (uint)bVar89 * iVar197 |
                                 (uint)!bVar89 *
                                 ((uint)bVar31 * auVar165._24_4_ | (uint)!bVar31 * iVar197);
                            bVar89 = (bool)((byte)(uVar94 >> 7) & 1);
                            auVar225._28_4_ =
                                 (uint)bVar89 * iVar198 |
                                 (uint)!bVar89 *
                                 ((uint)bVar32 * auVar165._28_4_ | (uint)!bVar32 * iVar198);
                            bVar89 = (bool)((byte)(uVar94 >> 8) & 1);
                            auVar225._32_4_ =
                                 (uint)bVar89 * iVar199 |
                                 (uint)!bVar89 *
                                 ((uint)(bVar34 & 1) * auVar165._32_4_ |
                                 (uint)!(bool)(bVar34 & 1) * iVar199);
                            bVar89 = (bool)((byte)(uVar94 >> 9) & 1);
                            auVar225._36_4_ =
                                 (uint)bVar89 * iVar200 |
                                 (uint)!bVar89 *
                                 ((uint)bVar35 * auVar165._36_4_ | (uint)!bVar35 * iVar200);
                            bVar89 = (bool)((byte)(uVar94 >> 10) & 1);
                            auVar225._40_4_ =
                                 (uint)bVar89 * iVar201 |
                                 (uint)!bVar89 *
                                 ((uint)bVar36 * auVar165._40_4_ | (uint)!bVar36 * iVar201);
                            bVar89 = (bool)((byte)(uVar94 >> 0xb) & 1);
                            auVar225._44_4_ =
                                 (uint)bVar89 * iVar202 |
                                 (uint)!bVar89 *
                                 ((uint)bVar37 * auVar165._44_4_ | (uint)!bVar37 * iVar202);
                            bVar89 = (bool)((byte)(uVar94 >> 0xc) & 1);
                            auVar225._48_4_ =
                                 (uint)bVar89 * iVar203 |
                                 (uint)!bVar89 *
                                 ((uint)bVar38 * auVar165._48_4_ | (uint)!bVar38 * iVar203);
                            bVar89 = (bool)((byte)(uVar94 >> 0xd) & 1);
                            auVar225._52_4_ =
                                 (uint)bVar89 * iVar204 |
                                 (uint)!bVar89 *
                                 ((uint)bVar39 * auVar165._52_4_ | (uint)!bVar39 * iVar204);
                            bVar89 = (bool)((byte)(uVar94 >> 0xe) & 1);
                            auVar225._56_4_ =
                                 (uint)bVar89 * iVar205 |
                                 (uint)!bVar89 *
                                 ((uint)bVar40 * auVar165._56_4_ | (uint)!bVar40 * iVar205);
                            bVar89 = SUB81(uVar94 >> 0xf,0);
                            auVar225._60_4_ =
                                 (uint)bVar89 * iVar206 |
                                 (uint)!bVar89 *
                                 ((uint)bVar41 * auVar165._60_4_ | (uint)!bVar41 * iVar206);
                            uVar91 = uVar91 + 0x10;
                            auVar218 = vpaddq_avx512f(auVar218,auVar158);
                            auVar163 = vpaddq_avx512f(auVar163,auVar158);
                            auVar164 = vpaddd_avx512f(auVar164,auVar159);
                          } while ((uVar15 + 0xf & 0xfffffff0) != uVar91);
                          bVar89 = (bool)((byte)uVar43 & 1);
                          auVar191._0_4_ = bVar89 * auVar225._0_4_ | (uint)!bVar89 * iVar84;
                          bVar89 = (bool)((byte)(uVar104 >> 1) & 1);
                          auVar191._4_4_ = bVar89 * auVar225._4_4_ | (uint)!bVar89 * iVar192;
                          bVar89 = (bool)((byte)(uVar104 >> 2) & 1);
                          auVar191._8_4_ = bVar89 * auVar225._8_4_ | (uint)!bVar89 * iVar193;
                          bVar89 = (bool)((byte)(uVar104 >> 3) & 1);
                          auVar191._12_4_ = bVar89 * auVar225._12_4_ | (uint)!bVar89 * iVar194;
                          bVar89 = (bool)((byte)(uVar104 >> 4) & 1);
                          auVar191._16_4_ = bVar89 * auVar225._16_4_ | (uint)!bVar89 * iVar195;
                          bVar89 = (bool)((byte)(uVar104 >> 5) & 1);
                          auVar191._20_4_ = bVar89 * auVar225._20_4_ | (uint)!bVar89 * iVar196;
                          bVar89 = (bool)((byte)(uVar104 >> 6) & 1);
                          auVar191._24_4_ = bVar89 * auVar225._24_4_ | (uint)!bVar89 * iVar197;
                          bVar89 = (bool)((byte)(uVar104 >> 7) & 1);
                          auVar191._28_4_ = bVar89 * auVar225._28_4_ | (uint)!bVar89 * iVar198;
                          auVar191._32_4_ =
                               (bVar33 & 1) * auVar225._32_4_ | (uint)!(bool)(bVar33 & 1) * iVar199;
                          bVar89 = (bool)(bVar33 >> 1 & 1);
                          auVar191._36_4_ = bVar89 * auVar225._36_4_ | (uint)!bVar89 * iVar200;
                          bVar89 = (bool)(bVar33 >> 2 & 1);
                          auVar191._40_4_ = bVar89 * auVar225._40_4_ | (uint)!bVar89 * iVar201;
                          bVar89 = (bool)(bVar33 >> 3 & 1);
                          auVar191._44_4_ = bVar89 * auVar225._44_4_ | (uint)!bVar89 * iVar202;
                          bVar89 = (bool)(bVar33 >> 4 & 1);
                          auVar191._48_4_ = bVar89 * auVar225._48_4_ | (uint)!bVar89 * iVar203;
                          bVar89 = (bool)(bVar33 >> 5 & 1);
                          auVar191._52_4_ = bVar89 * auVar225._52_4_ | (uint)!bVar89 * iVar204;
                          bVar89 = (bool)(bVar33 >> 6 & 1);
                          auVar191._56_4_ = bVar89 * auVar225._56_4_ | (uint)!bVar89 * iVar205;
                          auVar191._60_4_ =
                               (bVar33 >> 7) * auVar225._60_4_ |
                               (uint)!(bool)(bVar33 >> 7) * iVar206;
                          auVar151 = vextractf64x4_avx512f(auVar191,1);
                          auVar218 = vaddps_avx512f(auVar191,ZEXT3264(auVar151));
                          auVar113._0_4_ = auVar218._0_4_ + auVar218._16_4_;
                          auVar113._4_4_ = auVar218._4_4_ + auVar218._20_4_;
                          auVar113._8_4_ = auVar218._8_4_ + auVar218._24_4_;
                          auVar113._12_4_ = auVar218._12_4_ + auVar218._28_4_;
                          auVar105 = vshufpd_avx(auVar113,auVar113,1);
                          auVar114._0_4_ = auVar113._0_4_ + auVar105._0_4_;
                          auVar114._4_4_ = auVar113._4_4_ + auVar105._4_4_;
                          auVar114._8_4_ = auVar113._8_4_ + auVar105._8_4_;
                          auVar114._12_4_ = auVar113._12_4_ + auVar105._12_4_;
                          auVar105 = vhaddps_avx(auVar114,auVar114);
                          auVar218 = ZEXT1664(auVar105);
                        }
                        auVar105 = auVar218._0_16_;
                        uVar103 = uVar103 + 1;
                        pvVar99 = (void *)((long)pvVar99 + (ulong)uVar15 * 4);
                      } while (uVar103 != uVar93);
                    }
                    __x = auVar105._0_4_;
                    fVar207 = __x;
                    switch(iVar79) {
                    case 1:
                      auVar105 = vmaxss_avx(auVar105,ZEXT416(0));
                      fVar207 = auVar105._0_4_;
                      break;
                    case 2:
                      uVar43 = vcmpss_avx512f(auVar105,ZEXT416(0),0xe);
                      bVar89 = (bool)((byte)uVar43 & 1);
                      fVar207 = (float)((uint)bVar89 * 0x3f800000 + (uint)!bVar89 * (int)*pfVar23) *
                                __x;
                      break;
                    case 3:
                      auVar105 = vmaxss_avx(auVar105,ZEXT416((uint)*pfVar23));
                      fVar207 = auVar105._0_4_;
                      if (pfVar23[1] < auVar105._0_4_) {
                        fVar207 = pfVar23[1];
                      }
                      break;
                    case 4:
                      auVar105 = vminss_avx(auVar105,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar116._8_4_ = 0x80000000;
                      auVar116._0_8_ = 0x8000000080000000;
                      auVar116._12_4_ = 0x80000000;
                      auVar106 = vxorps_avx512vl(auVar105,auVar116);
                      uVar43 = vcmpss_avx512f(auVar105,ZEXT416(0xc2b0c0a5),1);
                      bVar89 = (bool)((byte)uVar43 & 1);
                      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                      fVar207 = expf((float)((uint)bVar89 * 0x42b0c0a5 +
                                            (uint)!bVar89 * auVar106._0_4_));
                      auVar159 = vpbroadcastd_avx512f(ZEXT416(0x10));
                      auVar158 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      auVar157 = vpternlogd_avx512f(auVar157,auVar157,auVar157,0xff);
                      auVar156 = vpmovsxbd_avx512f(_DAT_00613604);
                      auVar155 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      auVar154 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar153 = vmovdqu64_avx512f(local_b8);
                      auVar210 = ZEXT1264(ZEXT812(0));
                      fVar207 = 1.0 / (fVar207 + 1.0);
                      break;
                    case 5:
                      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                      fVar207 = expf(__x);
                      fVar207 = logf(fVar207 + 1.0);
                      fVar207 = tanhf(fVar207);
                      auVar159 = vpbroadcastd_avx512f(ZEXT416(0x10));
                      auVar158 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      auVar157 = vpternlogd_avx512f(auVar157,auVar157,auVar157,0xff);
                      auVar156 = vpmovsxbd_avx512f(_DAT_00613604);
                      auVar155 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      auVar154 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar153 = vmovdqu64_avx512f(local_b8);
                      auVar210 = ZEXT1264(ZEXT812(0));
                      fVar207 = fVar207 * __x;
                      break;
                    case 6:
                      fVar2 = *pfVar23;
                      auVar115._8_4_ = 0x80000000;
                      auVar115._0_8_ = 0x8000000080000000;
                      auVar115._12_4_ = 0x80000000;
                      auVar106 = vxorps_avx512vl(ZEXT416((uint)pfVar23[1]),auVar115);
                      fVar213 = auVar106._0_4_ / fVar2;
                      fVar207 = 0.0;
                      if ((fVar213 <= __x) && (fVar207 = __x, __x <= fVar213 + 1.0 / fVar2)) {
                        auVar105 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar105,
                                                   ZEXT416((uint)pfVar23[1]));
                        fVar207 = auVar105._0_4_ * __x;
                      }
                    }
                    *local_370 = fVar207;
                    local_370 = local_370 + 1;
                    iVar80 = iVar80 + 1;
                  } while (iVar80 != iVar87);
                }
                iVar86 = iVar86 + 1;
              } while (iVar86 != iVar92);
            }
            local_320 = local_320 + 1;
            local_2e0 = (void *)((long)local_2e0 + CONCAT44(iStack_264,local_268));
          } while (local_320 != local_270);
        }
      }
      else if ((iVar86 == 4) && (0 < (int)uVar15)) {
        uVar17 = vpcmpd_avx512vl((undefined1  [16])0x0,local_1b8,1);
        local_280 = (void *)CONCAT44(local_280._4_4_,(int)(uVar17 & 0xf));
        local_368 = 0;
        auVar211._8_4_ = 0x42b0c0a5;
        auVar211._0_8_ = 0x42b0c0a542b0c0a5;
        auVar211._12_4_ = 0x42b0c0a5;
        auVar214._8_4_ = 0xc2b0c0a5;
        auVar214._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar214._12_4_ = 0xc2b0c0a5;
        auVar216._8_4_ = 0x3f000000;
        auVar216._0_8_ = 0x3f0000003f000000;
        auVar216._12_4_ = 0x3f000000;
        auVar219._8_4_ = 0x3fb8aa3b;
        auVar219._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar219._12_4_ = 0x3fb8aa3b;
        auVar221._8_4_ = 0x3f800000;
        auVar221._0_8_ = 0x3f8000003f800000;
        auVar221._12_4_ = 0x3f800000;
        auVar223._8_4_ = 0x3f318000;
        auVar223._0_8_ = 0x3f3180003f318000;
        auVar223._12_4_ = 0x3f318000;
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar233._8_4_ = 0x3ab743ce;
        auVar233._0_8_ = 0x3ab743ce3ab743ce;
        auVar233._12_4_ = 0x3ab743ce;
        auVar236._8_4_ = 0x3c088908;
        auVar236._0_8_ = 0x3c0889083c088908;
        auVar236._12_4_ = 0x3c088908;
        auVar238._8_4_ = 0x3d2aa9c1;
        auVar238._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar238._12_4_ = 0x3d2aa9c1;
        auVar240._8_4_ = 0x3e2aaaaa;
        auVar240._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar240._12_4_ = 0x3e2aaaaa;
        auVar242._8_4_ = 0x3f800000;
        auVar242._0_8_ = 0x3f8000003f800000;
        auVar242._12_4_ = 0x3f800000;
        auVar244._8_4_ = 0xb95e8083;
        auVar244._0_8_ = 0xb95e8083b95e8083;
        auVar244._12_4_ = 0xb95e8083;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          if (((uVar17 & 0xf) >> 1 & 1) != 0) {
            pvVar20 = (this->weight_data_tm).data;
            sVar100 = bottom_blob->cstep;
            sVar21 = bottom_blob->elemsize;
            pvVar99 = bottom_blob->data;
            iVar95 = bottom_blob->w;
            pauVar98 = (undefined1 (*) [16])
                       (local_2c8.cstep * local_368 * local_2c8.elemsize + (long)local_2c8.data);
            local_278 = local_368 * 0x10;
            iVar83 = 0;
            do {
              if ((uVar17 & 1) != 0) {
                iVar79 = 0;
                local_384 = -local_f8._0_4_;
                do {
                  if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                    auVar210 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar210 = ZEXT1664(*(undefined1 (*) [16])
                                         ((long)(this->super_DeconvolutionDepthWise).bias_data.data
                                         + local_278));
                  }
                  auVar125 = auVar210._0_16_;
                  iVar86 = (this->super_DeconvolutionDepthWise).kernel_h;
                  if (0 < iVar86) {
                    iVar16 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar15 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar90 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar103 = 0;
                    lVar102 = 0;
                    do {
                      iVar80 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar102 +
                               (iVar83 - local_f8._4_4_);
                      if ((((-1 < iVar80) && (iVar81 = iVar80 / iVar16, iVar80 % iVar16 == 0)) &&
                          (iVar81 < iStack_264)) && (0 < (int)uVar15)) {
                        uVar94 = uVar103;
                        uVar101 = (ulong)uVar15;
                        iVar80 = local_384;
                        do {
                          if ((-1 < iVar80) &&
                             (iVar82 = iVar80 / iVar90, iVar82 < local_268 && iVar80 % iVar90 == 0))
                          {
                            auVar125 = vfmadd231ps_fma(auVar210._0_16_,
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar99 +
                                                        (long)(iVar82 << 2) * 4 +
                                                        (long)iVar81 * (long)iVar95 * sVar21 +
                                                        sVar100 * local_368 * sVar21),
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar20 +
                                                        (uVar94 & 0xffffffff) * 4 +
                                                        (long)(int)(uVar93 * 4 * (int)local_368) * 4
                                                        ));
                            auVar210 = ZEXT1664(auVar125);
                          }
                          iVar80 = iVar80 + (this->super_DeconvolutionDepthWise).dilation_w;
                          uVar94 = uVar94 + 4;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      auVar125 = auVar210._0_16_;
                      lVar102 = lVar102 + 1;
                      uVar103 = uVar103 + (ulong)uVar15 * 4;
                    } while (lVar102 != iVar86);
                  }
                  switch((this->super_DeconvolutionDepthWise).activation_type) {
                  case 1:
                    auVar125 = vmaxps_avx(auVar125,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar127 = vmaxps_avx(auVar125,(undefined1  [16])0x0);
                    auVar125 = vminps_avx(auVar125,(undefined1  [16])0x0);
                    uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                    auVar50._4_4_ = uVar1;
                    auVar50._0_4_ = uVar1;
                    auVar50._8_4_ = uVar1;
                    auVar50._12_4_ = uVar1;
                    auVar125 = vfmadd132ps_avx512vl(auVar125,auVar127,auVar50);
                    break;
                  case 3:
                    puVar22 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar22;
                    auVar48._4_4_ = uVar1;
                    auVar48._0_4_ = uVar1;
                    auVar48._8_4_ = uVar1;
                    auVar48._12_4_ = uVar1;
                    auVar125 = vmaxps_avx512vl(auVar125,auVar48);
                    uVar1 = puVar22[1];
                    auVar49._4_4_ = uVar1;
                    auVar49._0_4_ = uVar1;
                    auVar49._8_4_ = uVar1;
                    auVar49._12_4_ = uVar1;
                    auVar125 = vminps_avx512vl(auVar125,auVar49);
                    break;
                  case 4:
                    auVar47._8_4_ = 0x80000000;
                    auVar47._0_8_ = 0x8000000080000000;
                    auVar47._12_4_ = 0x80000000;
                    auVar125 = vxorps_avx512vl(auVar125,auVar47);
                    auVar125 = vminps_avx(auVar125,auVar211);
                    auVar125 = vmaxps_avx(auVar125,auVar214);
                    auVar127 = vfmadd231ps_fma(auVar216,auVar125,auVar219);
                    auVar119 = vcvttps2dq_avx512vl(auVar127);
                    auVar119 = vcvtdq2ps_avx512vl(auVar119);
                    uVar103 = vcmpps_avx512vl(auVar127,auVar119,1);
                    auVar127 = vsubps_avx512vl(auVar119,auVar221);
                    bVar89 = (bool)((byte)uVar103 & 1);
                    auVar126._0_4_ = (uint)bVar89 * auVar127._0_4_ | (uint)!bVar89 * auVar119._0_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar126._4_4_ = (uint)bVar89 * auVar127._4_4_ | (uint)!bVar89 * auVar119._4_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar126._8_4_ = (uint)bVar89 * auVar127._8_4_ | (uint)!bVar89 * auVar119._8_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar126._12_4_ =
                         (uint)bVar89 * auVar127._12_4_ | (uint)!bVar89 * auVar119._12_4_;
                    auVar127 = vfmsub231ps_avx512vl(auVar125,auVar126,auVar223);
                    auVar125._8_4_ = 0x395e8083;
                    auVar125._0_8_ = 0x395e8083395e8083;
                    auVar125._12_4_ = 0x395e8083;
                    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar126,auVar125);
                    auVar226._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                    auVar226._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                    auVar226._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                    auVar226._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                    auVar125 = vfmadd213ps_fma(auVar105,auVar127,auVar233);
                    auVar125 = vfmadd213ps_fma(auVar125,auVar127,auVar236);
                    auVar125 = vfmadd213ps_fma(auVar125,auVar127,auVar238);
                    auVar125 = vfmadd213ps_fma(auVar125,auVar127,auVar240);
                    auVar125 = vfmadd213ps_fma(auVar125,auVar127,auVar216);
                    auVar125 = vfmadd213ps_fma(auVar125,auVar226,auVar127);
                    auVar208._0_4_ = auVar125._0_4_ + 1.0;
                    auVar208._4_4_ = auVar125._4_4_ + 1.0;
                    auVar208._8_4_ = auVar125._8_4_ + 1.0;
                    auVar208._12_4_ = auVar125._12_4_ + 1.0;
                    auVar125 = vcvttps2dq_avx512vl(auVar126);
                    auVar125 = vpslld_avx(auVar125,0x17);
                    auVar125 = vpaddd_avx(auVar125,auVar242);
                    auVar125 = vfmadd213ps_fma(auVar125,auVar208,auVar221);
                    auVar125 = vdivps_avx(auVar221,auVar125);
                    break;
                  case 5:
                    auVar127 = vminps_avx(auVar125,auVar211);
                    auVar127 = vmaxps_avx(auVar127,auVar214);
                    auVar119 = vfmadd213ps_fma(auVar219,auVar127,auVar216);
                    auVar118 = vcvttps2dq_avx512vl(auVar119);
                    auVar118 = vcvtdq2ps_avx512vl(auVar118);
                    uVar103 = vcmpps_avx512vl(auVar119,auVar118,1);
                    auVar119 = vsubps_avx512vl(auVar118,auVar221);
                    bVar89 = (bool)((byte)uVar103 & 1);
                    auVar120._0_4_ = (uint)bVar89 * auVar119._0_4_ | (uint)!bVar89 * auVar118._0_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar120._4_4_ = (uint)bVar89 * auVar119._4_4_ | (uint)!bVar89 * auVar118._4_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar120._8_4_ = (uint)bVar89 * auVar119._8_4_ | (uint)!bVar89 * auVar118._8_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar120._12_4_ =
                         (uint)bVar89 * auVar119._12_4_ | (uint)!bVar89 * auVar118._12_4_;
                    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar120,auVar223);
                    auVar127 = vfnmsub231ps_avx512vl(auVar127,auVar120,auVar244);
                    auVar228._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                    auVar228._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                    auVar228._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                    auVar228._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                    auVar119 = vfmadd213ps_avx512vl(auVar105,auVar127,auVar233);
                    auVar119 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar236);
                    auVar119 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar238);
                    auVar119 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar240);
                    auVar119 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar216);
                    auVar127 = vfmadd213ps_avx512vl(auVar119,auVar228,auVar127);
                    auVar119 = vaddps_avx512vl(auVar127,auVar221);
                    auVar127 = vcvttps2dq_avx512vl(auVar120);
                    auVar127 = vpslld_avx(auVar127,0x17);
                    auVar127 = vpaddd_avx(auVar127,auVar242);
                    auVar127 = vfmadd213ps_fma(auVar127,auVar119,auVar221);
                    uVar103 = vcmpps_avx512vl(auVar127,(undefined1  [16])0x0,2);
                    auVar229._8_4_ = 0x800000;
                    auVar229._0_8_ = 0x80000000800000;
                    auVar229._12_4_ = 0x800000;
                    auVar127 = vmaxps_avx512vl(auVar127,auVar229);
                    auVar229 = vpsrld_avx(auVar127,0x17);
                    auVar119 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar45._8_4_ = 0x3f000000;
                    auVar45._0_8_ = 0x3f0000003f000000;
                    auVar45._12_4_ = 0x3f000000;
                    auVar127 = vpternlogd_avx512vl(auVar127,auVar119,auVar45,0xea);
                    uVar94 = vcmpps_avx512vl(auVar127,auVar106,1);
                    auVar119 = vaddps_avx512vl(auVar127,auVar107);
                    auVar127 = vaddps_avx512vl(auVar119,auVar127);
                    bVar89 = (bool)((byte)uVar94 & 1);
                    auVar121._0_4_ = (uint)bVar89 * auVar127._0_4_ | (uint)!bVar89 * auVar119._0_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 1) & 1);
                    auVar121._4_4_ = (uint)bVar89 * auVar127._4_4_ | (uint)!bVar89 * auVar119._4_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 2) & 1);
                    auVar121._8_4_ = (uint)bVar89 * auVar127._8_4_ | (uint)!bVar89 * auVar119._8_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 3) & 1);
                    auVar121._12_4_ =
                         (uint)bVar89 * auVar127._12_4_ | (uint)!bVar89 * auVar119._12_4_;
                    auVar119 = vmulps_avx512vl(auVar121,auVar121);
                    auVar127 = vfmadd213ps_avx512vl(auVar108,auVar121,auVar109);
                    auVar127 = vfmadd213ps_avx512vl(auVar127,auVar121,auVar110);
                    auVar127 = vfmadd213ps_avx512vl(auVar127,auVar121,auVar111);
                    auVar127 = vfmadd213ps_avx512vl(auVar127,auVar121,auVar112);
                    auVar127 = vfmadd213ps_avx512vl(auVar127,auVar121,auVar113);
                    auVar127 = vfmadd213ps_avx512vl(auVar127,auVar121,auVar114);
                    auVar127 = vfmadd213ps_avx512vl(auVar127,auVar121,auVar115);
                    auVar127 = vfmadd213ps_avx512vl(auVar127,auVar121,auVar116);
                    auVar118 = vmulps_avx512vl(auVar119,auVar121);
                    auVar118 = vmulps_avx512vl(auVar118,auVar127);
                    auVar46._8_4_ = 0xffffff82;
                    auVar46._0_8_ = 0xffffff82ffffff82;
                    auVar46._12_4_ = 0xffffff82;
                    auVar127 = vpaddd_avx512vl(auVar229,auVar46);
                    auVar127 = vcvtdq2ps_avx(auVar127);
                    auVar229 = vsubps_avx512vl(auVar127,auVar221);
                    bVar89 = (bool)((byte)uVar94 & 1);
                    auVar122._0_4_ = (uint)bVar89 * auVar229._0_4_ | (uint)!bVar89 * auVar127._0_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 1) & 1);
                    auVar122._4_4_ = (uint)bVar89 * auVar229._4_4_ | (uint)!bVar89 * auVar127._4_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 2) & 1);
                    auVar122._8_4_ = (uint)bVar89 * auVar229._8_4_ | (uint)!bVar89 * auVar127._8_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 3) & 1);
                    auVar122._12_4_ =
                         (uint)bVar89 * auVar229._12_4_ | (uint)!bVar89 * auVar127._12_4_;
                    auVar127 = vfmadd231ps_avx512vl(auVar118,auVar122,auVar244);
                    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar216,auVar119);
                    auVar127 = vsubps_avx512vl(auVar127,auVar121);
                    auVar127 = vfnmadd231ps_fma(auVar127,auVar223,auVar122);
                    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar89 = (bool)((byte)uVar103 & 1);
                    auVar123._0_4_ =
                         (uint)bVar89 * auVar119._0_4_ |
                         (uint)!bVar89 * (int)(auVar127._0_4_ + auVar127._0_4_);
                    bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar123._4_4_ =
                         (uint)bVar89 * auVar119._4_4_ |
                         (uint)!bVar89 * (int)(auVar127._4_4_ + auVar127._4_4_);
                    bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar123._8_4_ =
                         (uint)bVar89 * auVar119._8_4_ |
                         (uint)!bVar89 * (int)(auVar127._8_4_ + auVar127._8_4_);
                    bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar123._12_4_ =
                         (uint)bVar89 * auVar119._12_4_ |
                         (uint)!bVar89 * (int)(auVar127._12_4_ + auVar127._12_4_);
                    auVar127 = vminps_avx(auVar123,auVar211);
                    auVar127 = vmaxps_avx(auVar127,auVar214);
                    auVar119 = vfmadd213ps_fma(auVar219,auVar127,auVar216);
                    auVar118 = vcvttps2dq_avx512vl(auVar119);
                    auVar118 = vcvtdq2ps_avx512vl(auVar118);
                    uVar103 = vcmpps_avx512vl(auVar119,auVar118,1);
                    auVar119 = vsubps_avx512vl(auVar118,auVar221);
                    bVar89 = (bool)((byte)uVar103 & 1);
                    auVar124._0_4_ = (uint)bVar89 * auVar119._0_4_ | (uint)!bVar89 * auVar118._0_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar124._4_4_ = (uint)bVar89 * auVar119._4_4_ | (uint)!bVar89 * auVar118._4_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar124._8_4_ = (uint)bVar89 * auVar119._8_4_ | (uint)!bVar89 * auVar118._8_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar124._12_4_ =
                         (uint)bVar89 * auVar119._12_4_ | (uint)!bVar89 * auVar118._12_4_;
                    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar124,auVar223);
                    auVar127 = vfnmsub231ps_avx512vl(auVar127,auVar124,auVar244);
                    auVar230._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                    auVar230._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                    auVar230._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                    auVar230._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                    auVar119 = vfmadd213ps_avx512vl(auVar105,auVar127,auVar233);
                    auVar119 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar236);
                    auVar119 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar238);
                    auVar119 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar240);
                    auVar119 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar216);
                    auVar127 = vfmadd213ps_avx512vl(auVar119,auVar230,auVar127);
                    auVar119 = vaddps_avx512vl(auVar127,auVar221);
                    auVar127 = vcvttps2dq_avx512vl(auVar124);
                    auVar127 = vpslld_avx(auVar127,0x17);
                    auVar127 = vpaddd_avx(auVar127,auVar242);
                    auVar127 = vfmadd213ps_fma(auVar127,auVar119,auVar221);
                    auVar127 = vdivps_avx512vl(auVar117,auVar127);
                    auVar125 = vfmsub231ps_fma(auVar125,auVar125,auVar127);
                    break;
                  case 6:
                    puVar22 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar22;
                    auVar118._4_4_ = uVar1;
                    auVar118._0_4_ = uVar1;
                    auVar118._8_4_ = uVar1;
                    auVar118._12_4_ = uVar1;
                    uVar1 = puVar22[1];
                    auVar127._4_4_ = uVar1;
                    auVar127._0_4_ = uVar1;
                    auVar127._8_4_ = uVar1;
                    auVar127._12_4_ = uVar1;
                    auVar127 = vfmadd213ps_avx512vl(auVar118,auVar125,auVar127);
                    auVar127 = vmaxps_avx(auVar127,(undefined1  [16])0x0);
                    auVar127 = vminps_avx(auVar127,auVar221);
                    auVar119._0_4_ = auVar127._0_4_ * auVar125._0_4_;
                    auVar119._4_4_ = auVar127._4_4_ * auVar125._4_4_;
                    auVar119._8_4_ = auVar127._8_4_ * auVar125._8_4_;
                    auVar119._12_4_ = auVar127._12_4_ * auVar125._12_4_;
                    auVar125 = auVar119;
                  }
                  *pauVar98 = auVar125;
                  pauVar98 = pauVar98 + 1;
                  iVar79 = iVar79 + 1;
                  local_384 = local_384 + 1;
                } while (iVar79 != iVar87);
              }
              iVar83 = iVar83 + 1;
            } while (iVar83 != iVar92);
          }
          local_368 = local_368 + 1;
        } while (local_368 != uVar91);
      }
    }
    else if (iVar86 == 8) {
      if (0 < (int)uVar15) {
        uVar17 = vpcmpd_avx512vl((undefined1  [16])0x0,local_1b8,1);
        local_280 = (void *)CONCAT44(local_280._4_4_,(int)(uVar17 & 0xf));
        local_368 = 0;
        auVar212._8_4_ = 0x42b0c0a5;
        auVar212._0_8_ = 0x42b0c0a542b0c0a5;
        auVar212._12_4_ = 0x42b0c0a5;
        auVar212._16_4_ = 0x42b0c0a5;
        auVar212._20_4_ = 0x42b0c0a5;
        auVar212._24_4_ = 0x42b0c0a5;
        auVar212._28_4_ = 0x42b0c0a5;
        auVar215._8_4_ = 0xc2b0c0a5;
        auVar215._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar215._12_4_ = 0xc2b0c0a5;
        auVar215._16_4_ = 0xc2b0c0a5;
        auVar215._20_4_ = 0xc2b0c0a5;
        auVar215._24_4_ = 0xc2b0c0a5;
        auVar215._28_4_ = 0xc2b0c0a5;
        auVar217._8_4_ = 0x3f000000;
        auVar217._0_8_ = 0x3f0000003f000000;
        auVar217._12_4_ = 0x3f000000;
        auVar217._16_4_ = 0x3f000000;
        auVar217._20_4_ = 0x3f000000;
        auVar217._24_4_ = 0x3f000000;
        auVar217._28_4_ = 0x3f000000;
        auVar220._8_4_ = 0x3fb8aa3b;
        auVar220._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar220._12_4_ = 0x3fb8aa3b;
        auVar220._16_4_ = 0x3fb8aa3b;
        auVar220._20_4_ = 0x3fb8aa3b;
        auVar220._24_4_ = 0x3fb8aa3b;
        auVar220._28_4_ = 0x3fb8aa3b;
        auVar222._8_4_ = 0x3f800000;
        auVar222._0_8_ = 0x3f8000003f800000;
        auVar222._12_4_ = 0x3f800000;
        auVar222._16_4_ = 0x3f800000;
        auVar222._20_4_ = 0x3f800000;
        auVar222._24_4_ = 0x3f800000;
        auVar222._28_4_ = 0x3f800000;
        auVar224._8_4_ = 0x3f318000;
        auVar224._0_8_ = 0x3f3180003f318000;
        auVar224._12_4_ = 0x3f318000;
        auVar224._16_4_ = 0x3f318000;
        auVar224._20_4_ = 0x3f318000;
        auVar224._24_4_ = 0x3f318000;
        auVar224._28_4_ = 0x3f318000;
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar234._8_4_ = 0x3ab743ce;
        auVar234._0_8_ = 0x3ab743ce3ab743ce;
        auVar234._12_4_ = 0x3ab743ce;
        auVar234._16_4_ = 0x3ab743ce;
        auVar234._20_4_ = 0x3ab743ce;
        auVar234._24_4_ = 0x3ab743ce;
        auVar234._28_4_ = 0x3ab743ce;
        auVar237._8_4_ = 0x3c088908;
        auVar237._0_8_ = 0x3c0889083c088908;
        auVar237._12_4_ = 0x3c088908;
        auVar237._16_4_ = 0x3c088908;
        auVar237._20_4_ = 0x3c088908;
        auVar237._24_4_ = 0x3c088908;
        auVar237._28_4_ = 0x3c088908;
        auVar239._8_4_ = 0x3d2aa9c1;
        auVar239._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar239._12_4_ = 0x3d2aa9c1;
        auVar239._16_4_ = 0x3d2aa9c1;
        auVar239._20_4_ = 0x3d2aa9c1;
        auVar239._24_4_ = 0x3d2aa9c1;
        auVar239._28_4_ = 0x3d2aa9c1;
        auVar241._8_4_ = 0x3e2aaaaa;
        auVar241._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar241._12_4_ = 0x3e2aaaaa;
        auVar241._16_4_ = 0x3e2aaaaa;
        auVar241._20_4_ = 0x3e2aaaaa;
        auVar241._24_4_ = 0x3e2aaaaa;
        auVar241._28_4_ = 0x3e2aaaaa;
        auVar243._8_4_ = 0x3f800000;
        auVar243._0_8_ = 0x3f8000003f800000;
        auVar243._12_4_ = 0x3f800000;
        auVar243._16_4_ = 0x3f800000;
        auVar243._20_4_ = 0x3f800000;
        auVar243._24_4_ = 0x3f800000;
        auVar243._28_4_ = 0x3f800000;
        auVar245._8_4_ = 0xb95e8083;
        auVar245._0_8_ = 0xb95e8083b95e8083;
        auVar245._12_4_ = 0xb95e8083;
        auVar245._16_4_ = 0xb95e8083;
        auVar245._20_4_ = 0xb95e8083;
        auVar245._24_4_ = 0xb95e8083;
        auVar245._28_4_ = 0xb95e8083;
        auVar129 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar130 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar132 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar133 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar135 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar136 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar137 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar138 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar139 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar140 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          if (((uVar17 & 0xf) >> 1 & 1) != 0) {
            pvVar20 = (this->weight_data_tm).data;
            sVar100 = bottom_blob->cstep;
            sVar21 = bottom_blob->elemsize;
            pvVar99 = bottom_blob->data;
            iVar95 = bottom_blob->w;
            pauVar97 = (undefined1 (*) [32])
                       (local_2c8.cstep * local_368 * local_2c8.elemsize + (long)local_2c8.data);
            local_278 = local_368 * 0x20;
            iVar83 = 0;
            do {
              if ((uVar17 & 1) != 0) {
                iVar79 = 0;
                local_384 = -local_f8._0_4_;
                do {
                  if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                    auVar210 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar210 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)(this->super_DeconvolutionDepthWise).bias_data.data
                                         + local_278));
                  }
                  iVar86 = (this->super_DeconvolutionDepthWise).kernel_h;
                  if (0 < iVar86) {
                    iVar16 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar15 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar90 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar103 = 0;
                    lVar102 = 0;
                    do {
                      iVar80 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar102 +
                               (iVar83 - local_f8._4_4_);
                      if ((((-1 < iVar80) && (iVar81 = iVar80 / iVar16, iVar80 % iVar16 == 0)) &&
                          (iVar81 < iStack_264)) && (0 < (int)uVar15)) {
                        uVar94 = uVar103;
                        uVar101 = (ulong)uVar15;
                        iVar80 = local_384;
                        do {
                          if ((-1 < iVar80) &&
                             (iVar82 = iVar80 / iVar90, iVar82 < local_268 && iVar80 % iVar90 == 0))
                          {
                            auVar105 = vfmadd231ps_fma(auVar210._0_32_,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar99 +
                                                        (long)(iVar82 << 3) * 4 +
                                                        (long)iVar81 * (long)iVar95 * sVar21 +
                                                        sVar100 * local_368 * sVar21),
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar20 +
                                                        (uVar94 & 0xffffffff) * 4 +
                                                        (long)(int)(uVar93 * 8 * (int)local_368) * 4
                                                        ));
                            auVar210 = ZEXT1664(auVar105);
                          }
                          iVar80 = iVar80 + (this->super_DeconvolutionDepthWise).dilation_w;
                          uVar94 = uVar94 + 8;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      lVar102 = lVar102 + 1;
                      uVar103 = uVar103 + (ulong)uVar15 * 8;
                    } while (lVar102 != iVar86);
                  }
                  auVar150 = auVar210._0_32_;
                  iVar86 = (this->super_DeconvolutionDepthWise).activation_type;
                  if (5 < iVar86 - 1U) goto LAB_004836f4;
                  auVar144 = ZEXT1632((undefined1  [16])0x0);
                  switch(iVar86) {
                  case 1:
                    auVar150 = vmaxps_avx(auVar150,ZEXT1632((undefined1  [16])0x0));
                    break;
                  case 2:
                    auVar141 = vmaxps_avx(auVar150,auVar144);
                    auVar150 = vminps_avx(auVar150,auVar144);
                    uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                    auVar56._4_4_ = uVar1;
                    auVar56._0_4_ = uVar1;
                    auVar56._8_4_ = uVar1;
                    auVar56._12_4_ = uVar1;
                    auVar56._16_4_ = uVar1;
                    auVar56._20_4_ = uVar1;
                    auVar56._24_4_ = uVar1;
                    auVar56._28_4_ = uVar1;
                    auVar150 = vfmadd132ps_avx512vl(auVar150,auVar141,auVar56);
                    break;
                  case 3:
                    puVar22 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar22;
                    auVar54._4_4_ = uVar1;
                    auVar54._0_4_ = uVar1;
                    auVar54._8_4_ = uVar1;
                    auVar54._12_4_ = uVar1;
                    auVar54._16_4_ = uVar1;
                    auVar54._20_4_ = uVar1;
                    auVar54._24_4_ = uVar1;
                    auVar54._28_4_ = uVar1;
                    auVar150 = vmaxps_avx512vl(auVar150,auVar54);
                    uVar1 = puVar22[1];
                    auVar55._4_4_ = uVar1;
                    auVar55._0_4_ = uVar1;
                    auVar55._8_4_ = uVar1;
                    auVar55._12_4_ = uVar1;
                    auVar55._16_4_ = uVar1;
                    auVar55._20_4_ = uVar1;
                    auVar55._24_4_ = uVar1;
                    auVar55._28_4_ = uVar1;
                    auVar150 = vminps_avx512vl(auVar150,auVar55);
                    break;
                  case 4:
                    auVar52._8_4_ = 0x80000000;
                    auVar52._0_8_ = 0x8000000080000000;
                    auVar52._12_4_ = 0x80000000;
                    auVar52._16_4_ = 0x80000000;
                    auVar52._20_4_ = 0x80000000;
                    auVar52._24_4_ = 0x80000000;
                    auVar52._28_4_ = 0x80000000;
                    auVar150 = vxorps_avx512vl(auVar150,auVar52);
                    auVar150 = vminps_avx(auVar150,auVar212);
                    auVar150 = vmaxps_avx(auVar150,auVar215);
                    auVar105 = vfmadd231ps_fma(auVar217,auVar150,auVar220);
                    auVar144 = vrndscaleps_avx512vl(ZEXT1632(auVar105),1);
                    uVar103 = vcmpps_avx512vl(ZEXT1632(auVar105),auVar144,1);
                    auVar141 = vsubps_avx512vl(auVar144,auVar222);
                    bVar89 = (bool)((byte)uVar103 & 1);
                    auVar149._0_4_ = (uint)bVar89 * auVar141._0_4_ | (uint)!bVar89 * auVar144._0_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar149._4_4_ = (uint)bVar89 * auVar141._4_4_ | (uint)!bVar89 * auVar144._4_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar149._8_4_ = (uint)bVar89 * auVar141._8_4_ | (uint)!bVar89 * auVar144._8_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar149._12_4_ =
                         (uint)bVar89 * auVar141._12_4_ | (uint)!bVar89 * auVar144._12_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                    auVar149._16_4_ =
                         (uint)bVar89 * auVar141._16_4_ | (uint)!bVar89 * auVar144._16_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                    auVar149._20_4_ =
                         (uint)bVar89 * auVar141._20_4_ | (uint)!bVar89 * auVar144._20_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                    auVar149._24_4_ =
                         (uint)bVar89 * auVar141._24_4_ | (uint)!bVar89 * auVar144._24_4_;
                    bVar89 = SUB81(uVar103 >> 7,0);
                    auVar149._28_4_ =
                         (uint)bVar89 * auVar141._28_4_ | (uint)!bVar89 * auVar144._28_4_;
                    auVar150 = vfmsub231ps_avx512vl(auVar150,auVar149,auVar224);
                    auVar53._8_4_ = 0x395e8083;
                    auVar53._0_8_ = 0x395e8083395e8083;
                    auVar53._12_4_ = 0x395e8083;
                    auVar53._16_4_ = 0x395e8083;
                    auVar53._20_4_ = 0x395e8083;
                    auVar53._24_4_ = 0x395e8083;
                    auVar53._28_4_ = 0x395e8083;
                    auVar150 = vfmsub231ps_avx512vl(auVar150,auVar149,auVar53);
                    auVar227._0_4_ = auVar150._0_4_ * auVar150._0_4_;
                    auVar227._4_4_ = auVar150._4_4_ * auVar150._4_4_;
                    auVar227._8_4_ = auVar150._8_4_ * auVar150._8_4_;
                    auVar227._12_4_ = auVar150._12_4_ * auVar150._12_4_;
                    auVar227._16_4_ = auVar150._16_4_ * auVar150._16_4_;
                    auVar227._20_4_ = auVar150._20_4_ * auVar150._20_4_;
                    auVar227._24_4_ = auVar150._24_4_ * auVar150._24_4_;
                    auVar227._28_4_ = 0;
                    auVar105 = vfmadd213ps_fma(auVar151,auVar150,auVar234);
                    auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar150,auVar237);
                    auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar150,auVar239);
                    auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar150,auVar241);
                    auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar150,auVar217);
                    auVar105 = vfmadd213ps_fma(ZEXT1632(auVar105),auVar227,auVar150);
                    auVar209._0_4_ = auVar105._0_4_ + 1.0;
                    auVar209._4_4_ = auVar105._4_4_ + 1.0;
                    auVar209._8_4_ = auVar105._8_4_ + 1.0;
                    auVar209._12_4_ = auVar105._12_4_ + 1.0;
                    auVar209._16_4_ = 0x3f800000;
                    auVar209._20_4_ = 0x3f800000;
                    auVar209._24_4_ = 0x3f800000;
                    auVar209._28_4_ = 0x3f800000;
                    auVar150 = vcvttps2dq_avx512vl(auVar149);
                    auVar150 = vpslld_avx2(auVar150,0x17);
                    auVar150 = vpaddd_avx2(auVar150,auVar243);
                    auVar105 = vfmadd213ps_fma(auVar150,auVar209,auVar222);
                    auVar150 = vdivps_avx(auVar222,ZEXT1632(auVar105));
                    break;
                  case 5:
                    auVar150 = vminps_avx(auVar150,auVar212);
                    auVar150 = vmaxps_avx(auVar150,auVar215);
                    auVar105 = vfmadd213ps_fma(auVar220,auVar150,auVar217);
                    auVar141 = vrndscaleps_avx512vl(ZEXT1632(auVar105),1);
                    uVar103 = vcmpps_avx512vl(ZEXT1632(auVar105),auVar141,1);
                    auVar142 = vsubps_avx512vl(auVar141,auVar222);
                    bVar89 = (bool)((byte)uVar103 & 1);
                    auVar143._0_4_ = (uint)bVar89 * auVar142._0_4_ | (uint)!bVar89 * auVar141._0_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar143._4_4_ = (uint)bVar89 * auVar142._4_4_ | (uint)!bVar89 * auVar141._4_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar143._8_4_ = (uint)bVar89 * auVar142._8_4_ | (uint)!bVar89 * auVar141._8_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar143._12_4_ =
                         (uint)bVar89 * auVar142._12_4_ | (uint)!bVar89 * auVar141._12_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                    auVar143._16_4_ =
                         (uint)bVar89 * auVar142._16_4_ | (uint)!bVar89 * auVar141._16_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                    auVar143._20_4_ =
                         (uint)bVar89 * auVar142._20_4_ | (uint)!bVar89 * auVar141._20_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                    auVar143._24_4_ =
                         (uint)bVar89 * auVar142._24_4_ | (uint)!bVar89 * auVar141._24_4_;
                    bVar89 = SUB81(uVar103 >> 7,0);
                    auVar143._28_4_ =
                         (uint)bVar89 * auVar142._28_4_ | (uint)!bVar89 * auVar141._28_4_;
                    auVar150 = vfmsub231ps_avx512vl(auVar150,auVar143,auVar224);
                    auVar150 = vfnmsub231ps_avx512vl(auVar150,auVar143,auVar245);
                    auVar231._0_4_ = auVar150._0_4_ * auVar150._0_4_;
                    auVar231._4_4_ = auVar150._4_4_ * auVar150._4_4_;
                    auVar231._8_4_ = auVar150._8_4_ * auVar150._8_4_;
                    auVar231._12_4_ = auVar150._12_4_ * auVar150._12_4_;
                    auVar231._16_4_ = auVar150._16_4_ * auVar150._16_4_;
                    auVar231._20_4_ = auVar150._20_4_ * auVar150._20_4_;
                    auVar231._24_4_ = auVar150._24_4_ * auVar150._24_4_;
                    auVar231._28_4_ = 0;
                    auVar141 = vfmadd213ps_avx512vl(auVar151,auVar150,auVar234);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar150,auVar237);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar150,auVar239);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar150,auVar241);
                    auVar141 = vfmadd213ps_avx512vl(auVar141,auVar150,auVar217);
                    auVar150 = vfmadd213ps_avx512vl(auVar141,auVar231,auVar150);
                    auVar141 = vaddps_avx512vl(auVar150,auVar222);
                    auVar150 = vcvttps2dq_avx512vl(auVar143);
                    auVar150 = vpslld_avx2(auVar150,0x17);
                    auVar150 = vpaddd_avx2(auVar150,auVar243);
                    auVar105 = vfmadd213ps_fma(auVar150,auVar141,auVar222);
                    uVar103 = vcmpps_avx512vl(ZEXT1632(auVar105),auVar144,2);
                    auVar150._8_4_ = 0x800000;
                    auVar150._0_8_ = 0x80000000800000;
                    auVar150._12_4_ = 0x800000;
                    auVar150._16_4_ = 0x800000;
                    auVar150._20_4_ = 0x800000;
                    auVar150._24_4_ = 0x800000;
                    auVar150._28_4_ = 0x800000;
                    auVar150 = vmaxps_avx512vl(ZEXT1632(auVar105),auVar150);
                    auVar142 = vpsrld_avx2(auVar150,0x17);
                    auVar141 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar144._8_4_ = 0x3f000000;
                    auVar144._0_8_ = 0x3f0000003f000000;
                    auVar144._12_4_ = 0x3f000000;
                    auVar144._16_4_ = 0x3f000000;
                    auVar144._20_4_ = 0x3f000000;
                    auVar144._24_4_ = 0x3f000000;
                    auVar144._28_4_ = 0x3f000000;
                    auVar150 = vpternlogd_avx512vl(auVar150,auVar141,auVar144,0xea);
                    uVar94 = vcmpps_avx512vl(auVar150,auVar129,1);
                    auVar144 = vaddps_avx512vl(auVar150,auVar130);
                    auVar150 = vaddps_avx512vl(auVar144,auVar150);
                    bVar89 = (bool)((byte)uVar94 & 1);
                    auVar145._0_4_ = (uint)bVar89 * auVar150._0_4_ | (uint)!bVar89 * auVar144._0_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 1) & 1);
                    auVar145._4_4_ = (uint)bVar89 * auVar150._4_4_ | (uint)!bVar89 * auVar144._4_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 2) & 1);
                    auVar145._8_4_ = (uint)bVar89 * auVar150._8_4_ | (uint)!bVar89 * auVar144._8_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 3) & 1);
                    auVar145._12_4_ =
                         (uint)bVar89 * auVar150._12_4_ | (uint)!bVar89 * auVar144._12_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 4) & 1);
                    auVar145._16_4_ =
                         (uint)bVar89 * auVar150._16_4_ | (uint)!bVar89 * auVar144._16_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 5) & 1);
                    auVar145._20_4_ =
                         (uint)bVar89 * auVar150._20_4_ | (uint)!bVar89 * auVar144._20_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 6) & 1);
                    auVar145._24_4_ =
                         (uint)bVar89 * auVar150._24_4_ | (uint)!bVar89 * auVar144._24_4_;
                    bVar89 = SUB81(uVar94 >> 7,0);
                    auVar145._28_4_ =
                         (uint)bVar89 * auVar150._28_4_ | (uint)!bVar89 * auVar144._28_4_;
                    auVar144 = vmulps_avx512vl(auVar145,auVar145);
                    auVar150 = vfmadd213ps_avx512vl(auVar131,auVar145,auVar132);
                    auVar150 = vfmadd213ps_avx512vl(auVar150,auVar145,auVar133);
                    auVar150 = vfmadd213ps_avx512vl(auVar150,auVar145,auVar134);
                    auVar150 = vfmadd213ps_avx512vl(auVar150,auVar145,auVar135);
                    auVar150 = vfmadd213ps_avx512vl(auVar150,auVar145,auVar136);
                    auVar150 = vfmadd213ps_avx512vl(auVar150,auVar145,auVar137);
                    auVar150 = vfmadd213ps_avx512vl(auVar150,auVar145,auVar138);
                    auVar150 = vfmadd213ps_avx512vl(auVar150,auVar145,auVar139);
                    auVar141 = vmulps_avx512vl(auVar144,auVar145);
                    auVar141 = vmulps_avx512vl(auVar141,auVar150);
                    auVar51._8_4_ = 0xffffff82;
                    auVar51._0_8_ = 0xffffff82ffffff82;
                    auVar51._12_4_ = 0xffffff82;
                    auVar51._16_4_ = 0xffffff82;
                    auVar51._20_4_ = 0xffffff82;
                    auVar51._24_4_ = 0xffffff82;
                    auVar51._28_4_ = 0xffffff82;
                    auVar150 = vpaddd_avx512vl(auVar142,auVar51);
                    auVar150 = vcvtdq2ps_avx(auVar150);
                    auVar142 = vsubps_avx512vl(auVar150,auVar222);
                    bVar89 = (bool)((byte)uVar94 & 1);
                    auVar146._0_4_ = (uint)bVar89 * auVar142._0_4_ | (uint)!bVar89 * auVar150._0_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 1) & 1);
                    auVar146._4_4_ = (uint)bVar89 * auVar142._4_4_ | (uint)!bVar89 * auVar150._4_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 2) & 1);
                    auVar146._8_4_ = (uint)bVar89 * auVar142._8_4_ | (uint)!bVar89 * auVar150._8_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 3) & 1);
                    auVar146._12_4_ =
                         (uint)bVar89 * auVar142._12_4_ | (uint)!bVar89 * auVar150._12_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 4) & 1);
                    auVar146._16_4_ =
                         (uint)bVar89 * auVar142._16_4_ | (uint)!bVar89 * auVar150._16_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 5) & 1);
                    auVar146._20_4_ =
                         (uint)bVar89 * auVar142._20_4_ | (uint)!bVar89 * auVar150._20_4_;
                    bVar89 = (bool)((byte)(uVar94 >> 6) & 1);
                    auVar146._24_4_ =
                         (uint)bVar89 * auVar142._24_4_ | (uint)!bVar89 * auVar150._24_4_;
                    bVar89 = SUB81(uVar94 >> 7,0);
                    auVar146._28_4_ =
                         (uint)bVar89 * auVar142._28_4_ | (uint)!bVar89 * auVar150._28_4_;
                    auVar150 = vfmadd231ps_avx512vl(auVar141,auVar146,auVar245);
                    auVar150 = vfmsub231ps_avx512vl(auVar150,auVar217,auVar144);
                    auVar150 = vsubps_avx512vl(auVar150,auVar145);
                    auVar105 = vfmsub231ps_fma(auVar150,auVar224,auVar146);
                    auVar150 = vmulps_avx512vl(ZEXT1632(auVar105),auVar140);
                    auVar144 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar89 = (bool)((byte)uVar103 & 1);
                    auVar147._0_4_ = (uint)bVar89 * auVar144._0_4_ | (uint)!bVar89 * auVar150._0_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar147._4_4_ = (uint)bVar89 * auVar144._4_4_ | (uint)!bVar89 * auVar150._4_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar147._8_4_ = (uint)bVar89 * auVar144._8_4_ | (uint)!bVar89 * auVar150._8_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar147._12_4_ =
                         (uint)bVar89 * auVar144._12_4_ | (uint)!bVar89 * auVar150._12_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                    auVar147._16_4_ =
                         (uint)bVar89 * auVar144._16_4_ | (uint)!bVar89 * auVar150._16_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                    auVar147._20_4_ =
                         (uint)bVar89 * auVar144._20_4_ | (uint)!bVar89 * auVar150._20_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                    auVar147._24_4_ =
                         (uint)bVar89 * auVar144._24_4_ | (uint)!bVar89 * auVar150._24_4_;
                    bVar89 = SUB81(uVar103 >> 7,0);
                    auVar147._28_4_ =
                         (uint)bVar89 * auVar144._28_4_ | (uint)!bVar89 * auVar150._28_4_;
                    auVar150 = vminps_avx(auVar147,auVar212);
                    auVar150 = vmaxps_avx(auVar150,auVar215);
                    auVar105 = vfmadd213ps_fma(auVar220,auVar150,auVar217);
                    auVar144 = vrndscaleps_avx512vl(ZEXT1632(auVar105),1);
                    uVar103 = vcmpps_avx512vl(ZEXT1632(auVar105),auVar144,1);
                    auVar141 = vsubps_avx512vl(auVar144,auVar222);
                    bVar89 = (bool)((byte)uVar103 & 1);
                    auVar148._0_4_ = (uint)bVar89 * auVar141._0_4_ | (uint)!bVar89 * auVar144._0_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                    auVar148._4_4_ = (uint)bVar89 * auVar141._4_4_ | (uint)!bVar89 * auVar144._4_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                    auVar148._8_4_ = (uint)bVar89 * auVar141._8_4_ | (uint)!bVar89 * auVar144._8_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                    auVar148._12_4_ =
                         (uint)bVar89 * auVar141._12_4_ | (uint)!bVar89 * auVar144._12_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                    auVar148._16_4_ =
                         (uint)bVar89 * auVar141._16_4_ | (uint)!bVar89 * auVar144._16_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                    auVar148._20_4_ =
                         (uint)bVar89 * auVar141._20_4_ | (uint)!bVar89 * auVar144._20_4_;
                    bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                    auVar148._24_4_ =
                         (uint)bVar89 * auVar141._24_4_ | (uint)!bVar89 * auVar144._24_4_;
                    bVar89 = SUB81(uVar103 >> 7,0);
                    auVar148._28_4_ =
                         (uint)bVar89 * auVar141._28_4_ | (uint)!bVar89 * auVar144._28_4_;
                    auVar150 = vfmsub231ps_avx512vl(auVar150,auVar148,auVar224);
                    auVar150 = vfnmsub231ps_avx512vl(auVar150,auVar148,auVar245);
                    auVar232._0_4_ = auVar150._0_4_ * auVar150._0_4_;
                    auVar232._4_4_ = auVar150._4_4_ * auVar150._4_4_;
                    auVar232._8_4_ = auVar150._8_4_ * auVar150._8_4_;
                    auVar232._12_4_ = auVar150._12_4_ * auVar150._12_4_;
                    auVar232._16_4_ = auVar150._16_4_ * auVar150._16_4_;
                    auVar232._20_4_ = auVar150._20_4_ * auVar150._20_4_;
                    auVar232._24_4_ = auVar150._24_4_ * auVar150._24_4_;
                    auVar232._28_4_ = 0;
                    auVar144 = vfmadd213ps_avx512vl(auVar151,auVar150,auVar234);
                    auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar237);
                    auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar239);
                    auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar241);
                    auVar144 = vfmadd213ps_avx512vl(auVar144,auVar150,auVar217);
                    auVar150 = vfmadd213ps_avx512vl(auVar144,auVar232,auVar150);
                    auVar144 = vaddps_avx512vl(auVar150,auVar222);
                    auVar150 = vcvttps2dq_avx512vl(auVar148);
                    auVar150 = vpslld_avx2(auVar150,0x17);
                    auVar150 = vpaddd_avx2(auVar150,auVar243);
                    auVar105 = vfmadd213ps_fma(auVar150,auVar144,auVar222);
                    auVar150 = vdivps_avx(auVar222,ZEXT1632(auVar105));
                    auVar150 = vfnmadd213ps_avx512vl(auVar150,auVar140,auVar130);
                    auVar128 = auVar150._0_28_;
                    goto LAB_004836e5;
                  case 6:
                    puVar22 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar1 = *puVar22;
                    auVar142._4_4_ = uVar1;
                    auVar142._0_4_ = uVar1;
                    auVar142._8_4_ = uVar1;
                    auVar142._12_4_ = uVar1;
                    auVar142._16_4_ = uVar1;
                    auVar142._20_4_ = uVar1;
                    auVar142._24_4_ = uVar1;
                    auVar142._28_4_ = uVar1;
                    uVar1 = puVar22[1];
                    auVar141._4_4_ = uVar1;
                    auVar141._0_4_ = uVar1;
                    auVar141._8_4_ = uVar1;
                    auVar141._12_4_ = uVar1;
                    auVar141._16_4_ = uVar1;
                    auVar141._20_4_ = uVar1;
                    auVar141._24_4_ = uVar1;
                    auVar141._28_4_ = uVar1;
                    auVar150 = vfmadd213ps_avx512vl(auVar142,auVar150,auVar141);
                    auVar150 = vmaxps_avx(auVar150,auVar144);
                    auVar150 = vminps_avx(auVar150,auVar222);
                    auVar128 = auVar150._0_28_;
LAB_004836e5:
                    auVar159._0_4_ = auVar128._0_4_ * auVar210._0_4_;
                    auVar159._4_4_ = auVar128._4_4_ * auVar210._4_4_;
                    auVar159._8_4_ = auVar128._8_4_ * auVar210._8_4_;
                    auVar159._12_4_ = auVar128._12_4_ * auVar210._12_4_;
                    auVar159._16_4_ = auVar128._16_4_ * auVar210._16_4_;
                    auVar159._20_4_ = auVar128._20_4_ * auVar210._20_4_;
                    auVar159._28_36_ = auVar210._28_36_;
                    auVar159._24_4_ = auVar128._24_4_ * auVar210._24_4_;
                    auVar150 = auVar159._0_32_;
                  }
LAB_004836f4:
                  *pauVar97 = auVar150;
                  pauVar97 = pauVar97 + 1;
                  iVar79 = iVar79 + 1;
                  local_384 = local_384 + 1;
                } while (iVar79 != iVar87);
              }
              iVar83 = iVar83 + 1;
            } while (iVar83 != iVar92);
          }
          local_368 = local_368 + 1;
        } while (local_368 != uVar91);
      }
    }
    else if ((iVar86 == 0x10) && (0 < (int)uVar15)) {
      uVar17 = vpcmpd_avx512vl((undefined1  [16])0x0,local_1b8,1);
      auVar210 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar159 = vxorps_avx512dq(auVar210,(undefined1  [64])_ps512_cephes_log_q2);
      auVar158 = vxorps_avx512dq(auVar210,(undefined1  [64])_ps512_cephes_log_q1);
      auVar157 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar156 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar210);
      local_280 = (void *)CONCAT44(local_280._4_4_,(int)(uVar17 & 0xf));
      local_368 = 0;
      auVar105 = vxorps_avx512vl(auVar105,auVar105);
      auVar153 = ZEXT1664(auVar105);
      auVar155 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar154 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if (((uVar17 & 0xf) >> 1 & 1) != 0) {
          pvVar20 = (this->weight_data_tm).data;
          sVar100 = bottom_blob->cstep;
          sVar21 = bottom_blob->elemsize;
          pvVar99 = bottom_blob->data;
          iVar95 = bottom_blob->w;
          pauVar96 = (undefined1 (*) [64])
                     (local_2c8.cstep * local_368 * local_2c8.elemsize + (long)local_2c8.data);
          local_278 = local_368 * 0x40;
          iVar83 = 0;
          do {
            if ((uVar17 & 1) != 0) {
              iVar79 = 0;
              local_384 = -local_f8._0_4_;
              do {
                if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                  auVar218 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar218 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)(this->super_DeconvolutionDepthWise).
                                                       bias_data.data + local_278));
                }
                iVar86 = (this->super_DeconvolutionDepthWise).kernel_h;
                if (0 < iVar86) {
                  iVar16 = (this->super_DeconvolutionDepthWise).stride_h;
                  uVar15 = (this->super_DeconvolutionDepthWise).kernel_w;
                  iVar90 = (this->super_DeconvolutionDepthWise).stride_w;
                  uVar103 = 0;
                  lVar102 = 0;
                  do {
                    iVar80 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar102 +
                             (iVar83 - local_f8._4_4_);
                    if ((((-1 < iVar80) && (iVar81 = iVar80 / iVar16, iVar80 % iVar16 == 0)) &&
                        (iVar81 < iStack_264)) && (0 < (int)uVar15)) {
                      uVar94 = uVar103;
                      uVar101 = (ulong)uVar15;
                      iVar80 = local_384;
                      do {
                        if ((-1 < iVar80) &&
                           (iVar82 = iVar80 / iVar90, iVar82 < local_268 && iVar80 % iVar90 == 0)) {
                          auVar218 = vfmadd231ps_avx512f(auVar218,*(undefined1 (*) [64])
                                                                   ((long)pvVar99 +
                                                                   (long)(iVar82 << 4) * 4 +
                                                                   (long)iVar81 *
                                                                   (long)iVar95 * sVar21 +
                                                                   sVar100 * local_368 * sVar21),
                                                         *(undefined1 (*) [64])
                                                          ((long)pvVar20 +
                                                          (uVar94 & 0xffffffff) * 4 +
                                                          (long)(int)(uVar93 * 0x10 * (int)local_368
                                                                     ) * 4));
                        }
                        iVar80 = iVar80 + (this->super_DeconvolutionDepthWise).dilation_w;
                        uVar94 = uVar94 + 0x10;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    lVar102 = lVar102 + 1;
                    uVar103 = uVar103 + (ulong)uVar15 * 0x10;
                  } while (lVar102 != iVar86);
                }
                switch((this->super_DeconvolutionDepthWise).activation_type) {
                case 1:
                  auVar218 = vmaxps_avx512f(auVar218,auVar153);
                  break;
                case 2:
                  uVar103 = vcmpps_avx512f(auVar218,auVar153,1);
                  uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar58._4_4_ = uVar1;
                  auVar58._0_4_ = uVar1;
                  auVar58._8_4_ = uVar1;
                  auVar58._12_4_ = uVar1;
                  auVar58._16_4_ = uVar1;
                  auVar58._20_4_ = uVar1;
                  auVar58._24_4_ = uVar1;
                  auVar58._28_4_ = uVar1;
                  auVar58._32_4_ = uVar1;
                  auVar58._36_4_ = uVar1;
                  auVar58._40_4_ = uVar1;
                  auVar58._44_4_ = uVar1;
                  auVar58._48_4_ = uVar1;
                  auVar58._52_4_ = uVar1;
                  auVar58._56_4_ = uVar1;
                  auVar58._60_4_ = uVar1;
                  auVar160 = vmulps_avx512f(auVar218,auVar58);
                  bVar89 = (bool)((byte)uVar103 & 1);
                  auVar152._0_4_ = (uint)bVar89 * auVar160._0_4_ | (uint)!bVar89 * auVar218._0_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar152._4_4_ = (uint)bVar89 * auVar160._4_4_ | (uint)!bVar89 * auVar218._4_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar152._8_4_ = (uint)bVar89 * auVar160._8_4_ | (uint)!bVar89 * auVar218._8_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar152._12_4_ = (uint)bVar89 * auVar160._12_4_ | (uint)!bVar89 * auVar218._12_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar152._16_4_ = (uint)bVar89 * auVar160._16_4_ | (uint)!bVar89 * auVar218._16_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar152._20_4_ = (uint)bVar89 * auVar160._20_4_ | (uint)!bVar89 * auVar218._20_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar152._24_4_ = (uint)bVar89 * auVar160._24_4_ | (uint)!bVar89 * auVar218._24_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 7) & 1);
                  auVar152._28_4_ = (uint)bVar89 * auVar160._28_4_ | (uint)!bVar89 * auVar218._28_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 8) & 1);
                  auVar152._32_4_ = (uint)bVar89 * auVar160._32_4_ | (uint)!bVar89 * auVar218._32_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 9) & 1);
                  auVar152._36_4_ = (uint)bVar89 * auVar160._36_4_ | (uint)!bVar89 * auVar218._36_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 10) & 1);
                  auVar152._40_4_ = (uint)bVar89 * auVar160._40_4_ | (uint)!bVar89 * auVar218._40_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xb) & 1);
                  auVar152._44_4_ = (uint)bVar89 * auVar160._44_4_ | (uint)!bVar89 * auVar218._44_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xc) & 1);
                  auVar152._48_4_ = (uint)bVar89 * auVar160._48_4_ | (uint)!bVar89 * auVar218._48_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xd) & 1);
                  auVar152._52_4_ = (uint)bVar89 * auVar160._52_4_ | (uint)!bVar89 * auVar218._52_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xe) & 1);
                  auVar152._56_4_ = (uint)bVar89 * auVar160._56_4_ | (uint)!bVar89 * auVar218._56_4_
                  ;
                  bVar89 = SUB81(uVar103 >> 0xf,0);
                  auVar152._60_4_ = (uint)bVar89 * auVar160._60_4_ | (uint)!bVar89 * auVar218._60_4_
                  ;
                  auVar218 = auVar152;
                  break;
                case 3:
                  puVar22 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar22;
                  auVar57._4_4_ = uVar1;
                  auVar57._0_4_ = uVar1;
                  auVar57._8_4_ = uVar1;
                  auVar57._12_4_ = uVar1;
                  auVar57._16_4_ = uVar1;
                  auVar57._20_4_ = uVar1;
                  auVar57._24_4_ = uVar1;
                  auVar57._28_4_ = uVar1;
                  auVar57._32_4_ = uVar1;
                  auVar57._36_4_ = uVar1;
                  auVar57._40_4_ = uVar1;
                  auVar57._44_4_ = uVar1;
                  auVar57._48_4_ = uVar1;
                  auVar57._52_4_ = uVar1;
                  auVar57._56_4_ = uVar1;
                  auVar57._60_4_ = uVar1;
                  auVar160 = vmaxps_avx512f(auVar218,auVar57);
                  uVar1 = puVar22[1];
                  auVar218._4_4_ = uVar1;
                  auVar218._0_4_ = uVar1;
                  auVar218._8_4_ = uVar1;
                  auVar218._12_4_ = uVar1;
                  auVar218._16_4_ = uVar1;
                  auVar218._20_4_ = uVar1;
                  auVar218._24_4_ = uVar1;
                  auVar218._28_4_ = uVar1;
                  auVar218._32_4_ = uVar1;
                  auVar218._36_4_ = uVar1;
                  auVar218._40_4_ = uVar1;
                  auVar218._44_4_ = uVar1;
                  auVar218._48_4_ = uVar1;
                  auVar218._52_4_ = uVar1;
                  auVar218._56_4_ = uVar1;
                  auVar218._60_4_ = uVar1;
                  auVar218 = vminps_avx512f(auVar160,auVar218);
                  break;
                case 4:
                  auVar218 = vxorps_avx512dq(auVar218,auVar210);
                  auVar218 = vminps_avx512f(auVar218,(undefined1  [64])afVar60);
                  auVar218 = vmaxps_avx512f(auVar218,(undefined1  [64])afVar61);
                  auVar160 = vfmadd213ps_avx512f((undefined1  [64])afVar62,auVar218,
                                                 (undefined1  [64])afVar68);
                  auVar161 = vrndscaleps_avx512f(auVar160,1);
                  uVar103 = vcmpps_avx512f(auVar160,auVar161,1);
                  auVar160 = vsubps_avx512f(auVar161,(undefined1  [64])afVar59);
                  bVar89 = (bool)((byte)uVar103 & 1);
                  auVar166._0_4_ = (uint)bVar89 * auVar160._0_4_ | (uint)!bVar89 * auVar161._0_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar166._4_4_ = (uint)bVar89 * auVar160._4_4_ | (uint)!bVar89 * auVar161._4_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar166._8_4_ = (uint)bVar89 * auVar160._8_4_ | (uint)!bVar89 * auVar161._8_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar166._12_4_ = (uint)bVar89 * auVar160._12_4_ | (uint)!bVar89 * auVar161._12_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar166._16_4_ = (uint)bVar89 * auVar160._16_4_ | (uint)!bVar89 * auVar161._16_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar166._20_4_ = (uint)bVar89 * auVar160._20_4_ | (uint)!bVar89 * auVar161._20_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar166._24_4_ = (uint)bVar89 * auVar160._24_4_ | (uint)!bVar89 * auVar161._24_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 7) & 1);
                  auVar166._28_4_ = (uint)bVar89 * auVar160._28_4_ | (uint)!bVar89 * auVar161._28_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 8) & 1);
                  auVar166._32_4_ = (uint)bVar89 * auVar160._32_4_ | (uint)!bVar89 * auVar161._32_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 9) & 1);
                  auVar166._36_4_ = (uint)bVar89 * auVar160._36_4_ | (uint)!bVar89 * auVar161._36_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 10) & 1);
                  auVar166._40_4_ = (uint)bVar89 * auVar160._40_4_ | (uint)!bVar89 * auVar161._40_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xb) & 1);
                  auVar166._44_4_ = (uint)bVar89 * auVar160._44_4_ | (uint)!bVar89 * auVar161._44_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xc) & 1);
                  auVar166._48_4_ = (uint)bVar89 * auVar160._48_4_ | (uint)!bVar89 * auVar161._48_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xd) & 1);
                  auVar166._52_4_ = (uint)bVar89 * auVar160._52_4_ | (uint)!bVar89 * auVar161._52_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xe) & 1);
                  auVar166._56_4_ = (uint)bVar89 * auVar160._56_4_ | (uint)!bVar89 * auVar161._56_4_
                  ;
                  bVar89 = SUB81(uVar103 >> 0xf,0);
                  auVar166._60_4_ = (uint)bVar89 * auVar160._60_4_ | (uint)!bVar89 * auVar161._60_4_
                  ;
                  auVar218 = vfmadd231ps_avx512f(auVar218,auVar166,auVar159);
                  auVar218 = vfmadd231ps_avx512f(auVar218,auVar166,auVar158);
                  auVar160 = vmulps_avx512f(auVar218,auVar218);
                  auVar161 = vfmadd213ps_avx512f(auVar218,(undefined1  [64])afVar63,
                                                 (undefined1  [64])afVar64);
                  auVar161 = vfmadd213ps_avx512f(auVar161,auVar218,(undefined1  [64])afVar65);
                  auVar161 = vfmadd213ps_avx512f(auVar161,auVar218,(undefined1  [64])afVar66);
                  auVar161 = vfmadd213ps_avx512f(auVar161,auVar218,(undefined1  [64])afVar67);
                  auVar161 = vfmadd213ps_avx512f(auVar161,auVar218,(undefined1  [64])afVar68);
                  auVar218 = vfmadd213ps_avx512f(auVar161,auVar160,auVar218);
                  auVar218 = vaddps_avx512f(auVar218,(undefined1  [64])afVar59);
                  auVar160 = vcvttps2dq_avx512f(auVar166);
                  auVar160 = vpaddd_avx512f(auVar157,auVar160);
                  auVar160 = vpslld_avx512f(auVar160,0x17);
                  auVar218 = vfmadd213ps_avx512f(auVar160,auVar218,auVar155);
                  auVar218 = vdivps_avx512f(auVar155,auVar218);
                  break;
                case 5:
                  auVar160 = vminps_avx512f(auVar218,(undefined1  [64])afVar60);
                  auVar160 = vmaxps_avx512f(auVar160,(undefined1  [64])afVar61);
                  auVar161 = vfmadd213ps_avx512f((undefined1  [64])afVar62,auVar160,
                                                 (undefined1  [64])afVar68);
                  auVar162 = vrndscaleps_avx512f(auVar161,1);
                  uVar103 = vcmpps_avx512f(auVar161,auVar162,1);
                  auVar163 = vsubps_avx512f(auVar162,(undefined1  [64])afVar59);
                  bVar89 = (bool)((byte)uVar103 & 1);
                  auVar161._0_4_ = (uint)bVar89 * auVar163._0_4_ | (uint)!bVar89 * auVar162._0_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar161._4_4_ = (uint)bVar89 * auVar163._4_4_ | (uint)!bVar89 * auVar162._4_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar161._8_4_ = (uint)bVar89 * auVar163._8_4_ | (uint)!bVar89 * auVar162._8_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar161._12_4_ = (uint)bVar89 * auVar163._12_4_ | (uint)!bVar89 * auVar162._12_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar161._16_4_ = (uint)bVar89 * auVar163._16_4_ | (uint)!bVar89 * auVar162._16_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar161._20_4_ = (uint)bVar89 * auVar163._20_4_ | (uint)!bVar89 * auVar162._20_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar161._24_4_ = (uint)bVar89 * auVar163._24_4_ | (uint)!bVar89 * auVar162._24_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 7) & 1);
                  auVar161._28_4_ = (uint)bVar89 * auVar163._28_4_ | (uint)!bVar89 * auVar162._28_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 8) & 1);
                  auVar161._32_4_ = (uint)bVar89 * auVar163._32_4_ | (uint)!bVar89 * auVar162._32_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 9) & 1);
                  auVar161._36_4_ = (uint)bVar89 * auVar163._36_4_ | (uint)!bVar89 * auVar162._36_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 10) & 1);
                  auVar161._40_4_ = (uint)bVar89 * auVar163._40_4_ | (uint)!bVar89 * auVar162._40_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xb) & 1);
                  auVar161._44_4_ = (uint)bVar89 * auVar163._44_4_ | (uint)!bVar89 * auVar162._44_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xc) & 1);
                  auVar161._48_4_ = (uint)bVar89 * auVar163._48_4_ | (uint)!bVar89 * auVar162._48_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xd) & 1);
                  auVar161._52_4_ = (uint)bVar89 * auVar163._52_4_ | (uint)!bVar89 * auVar162._52_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xe) & 1);
                  auVar161._56_4_ = (uint)bVar89 * auVar163._56_4_ | (uint)!bVar89 * auVar162._56_4_
                  ;
                  bVar89 = SUB81(uVar103 >> 0xf,0);
                  auVar161._60_4_ = (uint)bVar89 * auVar163._60_4_ | (uint)!bVar89 * auVar162._60_4_
                  ;
                  auVar160 = vfmadd231ps_avx512f(auVar160,auVar161,auVar159);
                  auVar160 = vfmadd231ps_avx512f(auVar160,auVar161,auVar158);
                  auVar162 = vmulps_avx512f(auVar160,auVar160);
                  auVar163 = vfmadd213ps_avx512f(auVar160,(undefined1  [64])afVar63,
                                                 (undefined1  [64])afVar64);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar160,(undefined1  [64])afVar65);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar160,(undefined1  [64])afVar66);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar160,(undefined1  [64])afVar67);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar160,(undefined1  [64])afVar68);
                  auVar160 = vfmadd213ps_avx512f(auVar163,auVar162,auVar160);
                  auVar160 = vaddps_avx512f(auVar160,(undefined1  [64])afVar59);
                  auVar161 = vcvttps2dq_avx512f(auVar161);
                  auVar161 = vpaddd_avx512f(auVar157,auVar161);
                  auVar161 = vpslld_avx512f(auVar161,0x17);
                  auVar160 = vfmadd213ps_avx512f(auVar161,auVar160,auVar155);
                  auVar161 = vmaxps_avx512f(auVar160,(undefined1  [64])_ps512_min_norm_pos);
                  auVar162 = vpsrld_avx512f(auVar161,0x17);
                  auVar161 = vpternlogd_avx512f(auVar161,(undefined1  [64])afVar68,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar103 = vcmpps_avx512f(auVar161,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar163 = vsubps_avx512f(auVar161,(undefined1  [64])afVar59);
                  auVar161 = vaddps_avx512f(auVar163,auVar161);
                  bVar89 = (bool)((byte)uVar103 & 1);
                  auVar164._0_4_ = (uint)bVar89 * auVar161._0_4_ | (uint)!bVar89 * auVar163._0_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar164._4_4_ = (uint)bVar89 * auVar161._4_4_ | (uint)!bVar89 * auVar163._4_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar164._8_4_ = (uint)bVar89 * auVar161._8_4_ | (uint)!bVar89 * auVar163._8_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar164._12_4_ = (uint)bVar89 * auVar161._12_4_ | (uint)!bVar89 * auVar163._12_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar164._16_4_ = (uint)bVar89 * auVar161._16_4_ | (uint)!bVar89 * auVar163._16_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar164._20_4_ = (uint)bVar89 * auVar161._20_4_ | (uint)!bVar89 * auVar163._20_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar164._24_4_ = (uint)bVar89 * auVar161._24_4_ | (uint)!bVar89 * auVar163._24_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 7) & 1);
                  auVar164._28_4_ = (uint)bVar89 * auVar161._28_4_ | (uint)!bVar89 * auVar163._28_4_
                  ;
                  bVar33 = (byte)(uVar103 >> 8);
                  bVar89 = (bool)(bVar33 & 1);
                  auVar164._32_4_ = (uint)bVar89 * auVar161._32_4_ | (uint)!bVar89 * auVar163._32_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 9) & 1);
                  auVar164._36_4_ = (uint)bVar89 * auVar161._36_4_ | (uint)!bVar89 * auVar163._36_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 10) & 1);
                  auVar164._40_4_ = (uint)bVar89 * auVar161._40_4_ | (uint)!bVar89 * auVar163._40_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xb) & 1);
                  auVar164._44_4_ = (uint)bVar89 * auVar161._44_4_ | (uint)!bVar89 * auVar163._44_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xc) & 1);
                  auVar164._48_4_ = (uint)bVar89 * auVar161._48_4_ | (uint)!bVar89 * auVar163._48_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xd) & 1);
                  auVar164._52_4_ = (uint)bVar89 * auVar161._52_4_ | (uint)!bVar89 * auVar163._52_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xe) & 1);
                  auVar164._56_4_ = (uint)bVar89 * auVar161._56_4_ | (uint)!bVar89 * auVar163._56_4_
                  ;
                  bVar89 = SUB81(uVar103 >> 0xf,0);
                  auVar164._60_4_ = (uint)bVar89 * auVar161._60_4_ | (uint)!bVar89 * auVar163._60_4_
                  ;
                  auVar161 = vmulps_avx512f(auVar164,auVar164);
                  auVar163 = vfmadd132ps_avx512f(auVar164,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar164,(undefined1  [64])afVar69);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar164,(undefined1  [64])afVar70);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar164,(undefined1  [64])afVar71);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar164,(undefined1  [64])afVar72);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar164,(undefined1  [64])afVar73);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar164,(undefined1  [64])afVar74);
                  auVar163 = vfmadd213ps_avx512f(auVar163,auVar164,(undefined1  [64])afVar75);
                  auVar165 = vmulps_avx512f(auVar161,auVar164);
                  auVar163 = vfmadd213ps_avx512f(auVar165,auVar163,auVar164);
                  uVar94 = vcmpps_avx512f(auVar160,auVar153,2);
                  auVar160 = vpsubd_avx512f(auVar162,auVar157);
                  auVar160 = vcvtdq2ps_avx512f(auVar160);
                  auVar162 = vaddps_avx512f(auVar160,(undefined1  [64])afVar59);
                  bVar89 = (bool)((byte)uVar103 & 1);
                  auVar165._0_4_ = (uint)bVar89 * auVar160._0_4_ | (uint)!bVar89 * auVar162._0_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar165._4_4_ = (uint)bVar89 * auVar160._4_4_ | (uint)!bVar89 * auVar162._4_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar165._8_4_ = (uint)bVar89 * auVar160._8_4_ | (uint)!bVar89 * auVar162._8_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar165._12_4_ = (uint)bVar89 * auVar160._12_4_ | (uint)!bVar89 * auVar162._12_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar165._16_4_ = (uint)bVar89 * auVar160._16_4_ | (uint)!bVar89 * auVar162._16_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar165._20_4_ = (uint)bVar89 * auVar160._20_4_ | (uint)!bVar89 * auVar162._20_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar165._24_4_ = (uint)bVar89 * auVar160._24_4_ | (uint)!bVar89 * auVar162._24_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 7) & 1);
                  auVar165._28_4_ = (uint)bVar89 * auVar160._28_4_ | (uint)!bVar89 * auVar162._28_4_
                  ;
                  bVar89 = (bool)(bVar33 & 1);
                  auVar165._32_4_ = (uint)bVar89 * auVar160._32_4_ | (uint)!bVar89 * auVar162._32_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 9) & 1);
                  auVar165._36_4_ = (uint)bVar89 * auVar160._36_4_ | (uint)!bVar89 * auVar162._36_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 10) & 1);
                  auVar165._40_4_ = (uint)bVar89 * auVar160._40_4_ | (uint)!bVar89 * auVar162._40_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xb) & 1);
                  auVar165._44_4_ = (uint)bVar89 * auVar160._44_4_ | (uint)!bVar89 * auVar162._44_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xc) & 1);
                  auVar165._48_4_ = (uint)bVar89 * auVar160._48_4_ | (uint)!bVar89 * auVar162._48_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xd) & 1);
                  auVar165._52_4_ = (uint)bVar89 * auVar160._52_4_ | (uint)!bVar89 * auVar162._52_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xe) & 1);
                  auVar165._56_4_ = (uint)bVar89 * auVar160._56_4_ | (uint)!bVar89 * auVar162._56_4_
                  ;
                  bVar89 = SUB81(uVar103 >> 0xf,0);
                  auVar165._60_4_ = (uint)bVar89 * auVar160._60_4_ | (uint)!bVar89 * auVar162._60_4_
                  ;
                  auVar160 = vfmadd231ps_avx512f(auVar163,auVar165,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar160 = vfmadd231ps_avx512f(auVar160,auVar156,auVar161);
                  auVar160 = vfmadd231ps_avx512f(auVar160,auVar165,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar160 = vmulps_avx512f(auVar160,auVar154);
                  auVar161 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar89 = (bool)((byte)uVar94 & 1);
                  auVar162._0_4_ = (uint)bVar89 * auVar161._0_4_ | (uint)!bVar89 * auVar160._0_4_;
                  bVar89 = (bool)((byte)(uVar94 >> 1) & 1);
                  auVar162._4_4_ = (uint)bVar89 * auVar161._4_4_ | (uint)!bVar89 * auVar160._4_4_;
                  bVar89 = (bool)((byte)(uVar94 >> 2) & 1);
                  auVar162._8_4_ = (uint)bVar89 * auVar161._8_4_ | (uint)!bVar89 * auVar160._8_4_;
                  bVar89 = (bool)((byte)(uVar94 >> 3) & 1);
                  auVar162._12_4_ = (uint)bVar89 * auVar161._12_4_ | (uint)!bVar89 * auVar160._12_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 4) & 1);
                  auVar162._16_4_ = (uint)bVar89 * auVar161._16_4_ | (uint)!bVar89 * auVar160._16_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 5) & 1);
                  auVar162._20_4_ = (uint)bVar89 * auVar161._20_4_ | (uint)!bVar89 * auVar160._20_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 6) & 1);
                  auVar162._24_4_ = (uint)bVar89 * auVar161._24_4_ | (uint)!bVar89 * auVar160._24_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 7) & 1);
                  auVar162._28_4_ = (uint)bVar89 * auVar161._28_4_ | (uint)!bVar89 * auVar160._28_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 8) & 1);
                  auVar162._32_4_ = (uint)bVar89 * auVar161._32_4_ | (uint)!bVar89 * auVar160._32_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 9) & 1);
                  auVar162._36_4_ = (uint)bVar89 * auVar161._36_4_ | (uint)!bVar89 * auVar160._36_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 10) & 1);
                  auVar162._40_4_ = (uint)bVar89 * auVar161._40_4_ | (uint)!bVar89 * auVar160._40_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 0xb) & 1);
                  auVar162._44_4_ = (uint)bVar89 * auVar161._44_4_ | (uint)!bVar89 * auVar160._44_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 0xc) & 1);
                  auVar162._48_4_ = (uint)bVar89 * auVar161._48_4_ | (uint)!bVar89 * auVar160._48_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 0xd) & 1);
                  auVar162._52_4_ = (uint)bVar89 * auVar161._52_4_ | (uint)!bVar89 * auVar160._52_4_
                  ;
                  bVar89 = (bool)((byte)(uVar94 >> 0xe) & 1);
                  auVar162._56_4_ = (uint)bVar89 * auVar161._56_4_ | (uint)!bVar89 * auVar160._56_4_
                  ;
                  bVar89 = SUB81(uVar94 >> 0xf,0);
                  auVar162._60_4_ = (uint)bVar89 * auVar161._60_4_ | (uint)!bVar89 * auVar160._60_4_
                  ;
                  auVar160 = vminps_avx512f(auVar162,(undefined1  [64])afVar60);
                  auVar160 = vmaxps_avx512f(auVar160,(undefined1  [64])afVar61);
                  auVar161 = vfmadd213ps_avx512f((undefined1  [64])afVar62,auVar160,
                                                 (undefined1  [64])afVar68);
                  auVar162 = vrndscaleps_avx512f(auVar161,1);
                  uVar103 = vcmpps_avx512f(auVar161,auVar162,1);
                  auVar161 = vsubps_avx512f(auVar162,(undefined1  [64])afVar59);
                  bVar89 = (bool)((byte)uVar103 & 1);
                  auVar163._0_4_ = (uint)bVar89 * auVar161._0_4_ | (uint)!bVar89 * auVar162._0_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 1) & 1);
                  auVar163._4_4_ = (uint)bVar89 * auVar161._4_4_ | (uint)!bVar89 * auVar162._4_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 2) & 1);
                  auVar163._8_4_ = (uint)bVar89 * auVar161._8_4_ | (uint)!bVar89 * auVar162._8_4_;
                  bVar89 = (bool)((byte)(uVar103 >> 3) & 1);
                  auVar163._12_4_ = (uint)bVar89 * auVar161._12_4_ | (uint)!bVar89 * auVar162._12_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 4) & 1);
                  auVar163._16_4_ = (uint)bVar89 * auVar161._16_4_ | (uint)!bVar89 * auVar162._16_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 5) & 1);
                  auVar163._20_4_ = (uint)bVar89 * auVar161._20_4_ | (uint)!bVar89 * auVar162._20_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 6) & 1);
                  auVar163._24_4_ = (uint)bVar89 * auVar161._24_4_ | (uint)!bVar89 * auVar162._24_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 7) & 1);
                  auVar163._28_4_ = (uint)bVar89 * auVar161._28_4_ | (uint)!bVar89 * auVar162._28_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 8) & 1);
                  auVar163._32_4_ = (uint)bVar89 * auVar161._32_4_ | (uint)!bVar89 * auVar162._32_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 9) & 1);
                  auVar163._36_4_ = (uint)bVar89 * auVar161._36_4_ | (uint)!bVar89 * auVar162._36_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 10) & 1);
                  auVar163._40_4_ = (uint)bVar89 * auVar161._40_4_ | (uint)!bVar89 * auVar162._40_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xb) & 1);
                  auVar163._44_4_ = (uint)bVar89 * auVar161._44_4_ | (uint)!bVar89 * auVar162._44_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xc) & 1);
                  auVar163._48_4_ = (uint)bVar89 * auVar161._48_4_ | (uint)!bVar89 * auVar162._48_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xd) & 1);
                  auVar163._52_4_ = (uint)bVar89 * auVar161._52_4_ | (uint)!bVar89 * auVar162._52_4_
                  ;
                  bVar89 = (bool)((byte)(uVar103 >> 0xe) & 1);
                  auVar163._56_4_ = (uint)bVar89 * auVar161._56_4_ | (uint)!bVar89 * auVar162._56_4_
                  ;
                  bVar89 = SUB81(uVar103 >> 0xf,0);
                  auVar163._60_4_ = (uint)bVar89 * auVar161._60_4_ | (uint)!bVar89 * auVar162._60_4_
                  ;
                  auVar160 = vfmadd231ps_avx512f(auVar160,auVar163,auVar159);
                  auVar160 = vfmadd231ps_avx512f(auVar160,auVar163,auVar158);
                  auVar161 = vmulps_avx512f(auVar160,auVar160);
                  auVar162 = vfmadd213ps_avx512f(auVar160,(undefined1  [64])afVar63,
                                                 (undefined1  [64])afVar64);
                  auVar162 = vfmadd213ps_avx512f(auVar162,auVar160,(undefined1  [64])afVar65);
                  auVar162 = vfmadd213ps_avx512f(auVar162,auVar160,(undefined1  [64])afVar66);
                  auVar162 = vfmadd213ps_avx512f(auVar162,auVar160,(undefined1  [64])afVar67);
                  auVar162 = vfmadd213ps_avx512f(auVar162,auVar160,(undefined1  [64])afVar68);
                  auVar160 = vfmadd213ps_avx512f(auVar162,auVar161,auVar160);
                  auVar160 = vaddps_avx512f(auVar160,(undefined1  [64])afVar59);
                  auVar161 = vcvttps2dq_avx512f(auVar163);
                  auVar161 = vpaddd_avx512f(auVar161,auVar157);
                  auVar161 = vpslld_avx512f(auVar161,0x17);
                  auVar160 = vfmadd213ps_avx512f(auVar161,auVar160,auVar155);
                  auVar160 = vdivps_avx512f(auVar155,auVar160);
                  auVar160 = vfnmsub213ps_avx512f(auVar160,auVar154,auVar155);
                  goto LAB_00483048;
                case 6:
                  puVar19 = (uint *)(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar161 = vbroadcastss_avx512f(ZEXT416(*puVar19));
                  uVar15 = puVar19[1];
                  auVar160._4_4_ = uVar15;
                  auVar160._0_4_ = uVar15;
                  auVar160._8_4_ = uVar15;
                  auVar160._12_4_ = uVar15;
                  auVar160._16_4_ = uVar15;
                  auVar160._20_4_ = uVar15;
                  auVar160._24_4_ = uVar15;
                  auVar160._28_4_ = uVar15;
                  auVar160._32_4_ = uVar15;
                  auVar160._36_4_ = uVar15;
                  auVar160._40_4_ = uVar15;
                  auVar160._44_4_ = uVar15;
                  auVar160._48_4_ = uVar15;
                  auVar160._52_4_ = uVar15;
                  auVar160._56_4_ = uVar15;
                  auVar160._60_4_ = uVar15;
                  auVar160 = vfmadd213ps_avx512f(auVar161,auVar218,auVar160);
                  auVar160 = vmaxps_avx512f(auVar160,auVar153);
                  auVar160 = vminps_avx512f(auVar160,auVar155);
LAB_00483048:
                  auVar218 = vmulps_avx512f(auVar160,auVar218);
                }
                *pauVar96 = auVar218;
                pauVar96 = pauVar96 + 1;
                iVar79 = iVar79 + 1;
                local_384 = local_384 + 1;
              } while (iVar79 != iVar87);
            }
            iVar83 = iVar83 + 1;
          } while (iVar83 != iVar92);
        }
        local_368 = local_368 + 1;
      } while (local_368 != uVar91);
    }
  }
  else {
    uVar17 = (long)(int)(uVar15 * iVar86) / (long)iVar79;
    uVar103 = (long)iVar83 / (long)iVar79;
    local_308 = 1;
    local_318 = 1;
    if (opt->use_packing_layout == true) {
      local_318 = 0x10;
      local_308 = 0x10;
      if ((uVar17 & 0xf) != 0) {
        if ((uVar17 & 7) == 0) {
          local_308 = 8;
        }
        else {
          local_308 = (uint)((uVar17 & 3) == 0) * 3 + 1;
        }
      }
      if ((uVar103 & 0xf) != 0) {
        if ((uVar103 & 7) == 0) {
          local_318 = 8;
        }
        else {
          local_318 = (uint)((uVar103 & 3) == 0) * 3 + 1;
        }
      }
    }
    piVar18 = bottom_blob->refcount;
    local_208._0_8_ = bottom_blob->data;
    local_208._8_4_ = SUB84(bottom_blob->refcount,0);
    local_208._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_208._16_8_ = bottom_blob->elemsize;
    local_208._24_4_ = bottom_blob->elempack;
    local_208._32_8_ = bottom_blob->allocator;
    local_1e0._0_4_ = bottom_blob->dims;
    local_1e0._4_4_ = bottom_blob->w;
    local_1e0._8_4_ = bottom_blob->h;
    local_1e0._12_4_ = bottom_blob->d;
    local_1d0 = bottom_blob->c;
    local_1c8 = bottom_blob->cstep;
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + 1;
      UNLOCK();
    }
    if (local_308 < iVar86) {
      auVar210 = vmovdqu64_avx512f((undefined1  [64])*opt);
      auVar210 = vmovdqu64_avx512f(auVar210);
      stack0xfffffffffffffdb8 = auVar210._16_48_;
      local_258._0_8_ = auVar210._0_8_;
      local_258._8_8_ = opt->workspace_allocator;
      convert_packing(bottom_blob,(Mat *)local_208,local_308,(Option *)local_258);
      if ((void *)local_208._0_8_ == (void *)0x0) {
        local_338 = -100;
        bVar89 = false;
      }
      else {
        if ((long)local_1d0 * local_1c8 != 0) goto LAB_00484939;
        bVar89 = false;
        local_338 = -100;
      }
    }
    else {
LAB_00484939:
      auVar77 = auStack_23c;
      piVar18 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
      local_258._12_4_ = local_2c8.refcount._4_4_;
      local_258._8_4_ = local_2c8.refcount._0_4_;
      local_258._0_8_ = local_2c8.data;
      local_258._16_8_ = local_2c8.elemsize;
      iStack_240 = local_2c8.elempack;
      pAStack_238 = local_2c8.allocator;
      uStack_230._4_1_ = (bool)(undefined1)local_2c8.w;
      uStack_230._5_1_ = (bool)local_2c8.w._1_1_;
      uStack_230._6_1_ = (bool)local_2c8.w._2_1_;
      uStack_230._7_1_ = (bool)local_2c8.w._3_1_;
      uStack_230._0_4_ = local_2c8.dims;
      _iStack_228 = local_2c8._48_8_;
      auStack_23c._32_4_ = auVar77._32_4_;
      iStack_220._0_1_ = (bool)(undefined1)local_2c8.c;
      iStack_220._1_1_ = (bool)local_2c8.c._1_1_;
      iStack_220._2_1_ = (bool)local_2c8.c._2_1_;
      iStack_220._3_1_ = (bool)local_2c8.c._3_1_;
      local_218 = local_2c8.cstep;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      if (local_318 < uVar93) {
        Mat::create((Mat *)local_258,iVar87,iVar92,
                    (this->super_DeconvolutionDepthWise).num_output / (int)local_318,
                    (ulong)local_318 * (sVar100 / uVar93),local_318,opt->workspace_allocator);
        local_338 = -100;
        if (((void *)local_258._0_8_ != (void *)0x0) && ((long)iStack_220 * local_218 != 0))
        goto LAB_00484a4e;
        bVar89 = false;
      }
      else {
LAB_00484a4e:
        iVar95 = (this->super_DeconvolutionDepthWise).group;
        bVar89 = 0 < iVar95;
        if (iVar95 < 1) {
          local_338 = -100;
        }
        else {
          local_338 = -100;
          iVar92 = 0;
          iVar95 = 0;
          lVar102 = 0;
          do {
            local_148 = (void *)((long)(iVar92 / local_308) * local_1c8 * local_208._16_8_ +
                                local_208._0_8_);
            uStack_140 = 0;
            uStack_13c = 0;
            local_138 = local_208._16_8_;
            local_130 = local_208._24_4_;
            local_128 = (Allocator *)local_208._32_8_;
            local_108 = ((long)(int)local_1e0._12_4_ * local_208._16_8_ *
                         (long)(int)local_1e0._8_4_ * (long)(int)local_1e0._4_4_ + 0xfU &
                        0xfffffffffffffff0) / (ulong)local_208._16_8_;
            local_120 = local_1e0;
            local_198 = (void *)((long)(iVar95 / (int)local_318) * local_218 * local_258._16_8_ +
                                local_258._0_8_);
            uStack_190 = 0;
            uStack_18c = 0;
            local_188 = (Allocator *)local_258._16_8_;
            local_180 = iStack_240;
            local_178 = pAStack_238;
            local_158 = ((long)iStack_224 * local_258._16_8_ *
                         (long)iStack_228 * (long)uStack_230._4_4_ + 0xfU & 0xfffffffffffffff0) /
                        (ulong)local_258._16_8_;
            local_170 = local_258._40_16_;
            pLVar24 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar102];
            auVar210 = vmovdqu64_avx512f((undefined1  [64])*opt);
            auVar210 = vmovdqu64_avx512f(auVar210);
            auStack_68 = auVar210._16_48_;
            local_78 = auVar210._0_8_;
            pAStack_70 = pAStack_238;
            local_160 = (int)uVar103 / (int)local_318;
            local_110 = (int)uVar17 / local_308;
            iVar87 = (*pLVar24->_vptr_Layer[7])(pLVar24,&local_148,&local_198,&local_78);
            if (iVar87 != 0) {
              local_338 = iVar87;
            }
            piVar18 = (int *)CONCAT44(uStack_18c,uStack_190);
            if (piVar18 != (int *)0x0) {
              LOCK();
              *piVar18 = *piVar18 + -1;
              UNLOCK();
              if (*piVar18 == 0) {
                if (local_178 == (Allocator *)0x0) {
                  if (local_198 != (void *)0x0) {
                    free(local_198);
                  }
                }
                else {
                  (*local_178->_vptr_Allocator[3])();
                }
              }
            }
            local_158 = 0;
            local_198 = (void *)0x0;
            uStack_190 = 0;
            uStack_18c = 0;
            local_188 = (Allocator *)0x0;
            local_180 = 0;
            local_170 = (undefined1  [16])0x0;
            local_160 = 0;
            piVar18 = (int *)CONCAT44(uStack_13c,uStack_140);
            if (piVar18 != (int *)0x0) {
              LOCK();
              *piVar18 = *piVar18 + -1;
              UNLOCK();
              if (*piVar18 == 0) {
                if (local_128 == (Allocator *)0x0) {
                  if (local_148 != (void *)0x0) {
                    free(local_148);
                  }
                }
                else {
                  (*local_128->_vptr_Allocator[3])();
                }
              }
            }
            local_108 = 0;
            local_148 = (void *)0x0;
            uStack_140 = 0;
            uStack_13c = 0;
            local_138 = 0;
            local_130 = 0;
            local_120 = (undefined1  [16])0x0;
            local_110 = 0;
            if (iVar87 != 0) break;
            lVar102 = lVar102 + 1;
            lVar88 = (long)(this->super_DeconvolutionDepthWise).group;
            iVar95 = iVar95 + (int)uVar103;
            iVar92 = iVar92 + (int)uVar17;
            bVar89 = lVar102 < lVar88;
          } while (lVar102 < lVar88);
        }
        if (bVar89) {
          bVar89 = false;
        }
        else {
          if (local_318 < uVar93) {
            convert_packing((Mat *)local_258,&local_2c8,uVar93,opt);
            if ((local_2c8.data == (void *)0x0) || ((long)local_2c8.c * local_2c8.cstep == 0)) {
              bVar89 = false;
              local_338 = -100;
              goto LAB_00484f44;
            }
          }
          else {
            if ((Allocator *)local_258._8_8_ != (Allocator *)0x0) {
              LOCK();
              *(int *)(_func_int ***)local_258._8_8_ = *(int *)(_func_int ***)local_258._8_8_ + 1;
              UNLOCK();
            }
            piVar18 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
            if (piVar18 != (int *)0x0) {
              LOCK();
              *piVar18 = *piVar18 + -1;
              UNLOCK();
              if (*piVar18 == 0) {
                if (local_2c8.allocator == (Allocator *)0x0) {
                  if (local_2c8.data != (void *)0x0) {
                    free(local_2c8.data);
                  }
                }
                else {
                  (*(local_2c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            OVar76 = _local_258;
            local_2c8.data = (void *)local_258._0_8_;
            local_2c8.refcount._0_4_ = local_258._8_4_;
            local_2c8.refcount._4_4_ = local_258._12_4_;
            local_2c8.elemsize = local_258._16_8_;
            local_2c8.elempack = iStack_240;
            local_2c8.allocator = pAStack_238;
            local_2c8.dims = local_258._40_4_;
            local_2c8.w = local_258._44_4_;
            local_2c8.h = iStack_228;
            local_2c8.d = iStack_224;
            iStack_220 = OVar76._56_4_;
            local_2c8.c = iStack_220;
            local_2c8.cstep = local_218;
            _local_258 = OVar76;
          }
          bVar89 = true;
        }
      }
LAB_00484f44:
      if ((Allocator *)local_258._8_8_ != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_258._8_8_ = *(int *)(_func_int ***)local_258._8_8_ + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_258._8_8_ == 0) {
          if (pAStack_238 == (Allocator *)0x0) {
            if ((void *)local_258._0_8_ != (void *)0x0) {
              free((void *)local_258._0_8_);
            }
          }
          else {
            (*pAStack_238->_vptr_Allocator[3])();
          }
        }
      }
      auVar77 = auStack_23c;
      local_218 = 0;
      _local_258 = ZEXT1228(SUB1612((undefined1  [16])0x0,0));
      auStack_23c._32_4_ = auVar77._32_4_;
      _local_258 = ZEXT4060(_local_258);
    }
    piVar18 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
          if ((void *)local_208._0_8_ != (void *)0x0) {
            free((void *)local_208._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_208._32_8_)[3])();
        }
      }
    }
    local_1c8 = 0;
    local_208._0_8_ = (void *)0x0;
    local_208._8_4_ = 0;
    local_208._12_4_ = 0;
    local_208._16_8_ = 0;
    local_208._24_4_ = 0;
    local_1e0 = (undefined1  [16])0x0;
    local_1d0 = 0;
    if (!bVar89) goto LAB_00485071;
  }
  pMVar78 = local_1a0;
  DeconvolutionDepthWise::cut_padding
            (&this->super_DeconvolutionDepthWise,&local_2c8,local_1a0,local_e0);
  local_338 = -100;
  if ((pMVar78->data != (void *)0x0) &&
     (local_338 = -100, (long)local_1a0->c * local_1a0->cstep != 0)) {
    local_338 = 0;
  }
LAB_00485071:
  piVar18 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_338;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}